

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O1

void aom_lpf_horizontal_14_quad_sse2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  bool bVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  unkuint9 Var101;
  undefined1 auVar102 [11];
  undefined1 auVar103 [15];
  unkuint9 Var104;
  undefined1 auVar105 [11];
  undefined1 auVar106 [15];
  unkuint9 Var107;
  undefined1 auVar108 [11];
  undefined1 auVar109 [15];
  unkuint9 Var110;
  undefined1 auVar111 [11];
  undefined1 auVar112 [15];
  unkuint9 Var113;
  undefined1 auVar114 [11];
  undefined1 auVar115 [15];
  unkuint9 Var116;
  undefined1 auVar117 [11];
  undefined1 auVar118 [15];
  unkuint9 Var119;
  undefined1 auVar120 [11];
  undefined1 auVar121 [15];
  unkuint9 Var122;
  undefined1 auVar123 [11];
  undefined1 auVar124 [15];
  undefined1 auVar125 [11];
  undefined1 auVar126 [15];
  undefined1 auVar127 [11];
  undefined1 auVar128 [15];
  undefined1 auVar129 [11];
  undefined1 auVar130 [15];
  undefined1 auVar131 [11];
  undefined1 auVar132 [15];
  undefined1 auVar133 [11];
  undefined1 auVar134 [15];
  undefined1 auVar135 [11];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  undefined1 auVar154 [15];
  undefined1 auVar155 [15];
  undefined1 auVar156 [15];
  undefined1 auVar157 [15];
  undefined1 auVar158 [15];
  undefined1 auVar159 [15];
  undefined1 auVar160 [15];
  undefined1 auVar161 [15];
  undefined1 auVar162 [15];
  undefined1 auVar163 [15];
  long lVar164;
  long lVar165;
  long lVar166;
  byte bVar167;
  byte bVar180;
  ushort uVar168;
  ushort uVar169;
  byte bVar181;
  byte bVar186;
  short sVar182;
  byte bVar187;
  byte bVar190;
  short sVar188;
  byte bVar191;
  byte bVar194;
  short sVar192;
  byte bVar195;
  byte bVar198;
  short sVar196;
  byte bVar199;
  byte bVar203;
  short sVar200;
  byte bVar204;
  byte bVar207;
  short sVar205;
  byte bVar208;
  undefined1 auVar172 [16];
  ushort uVar183;
  ushort uVar189;
  ushort uVar193;
  ushort uVar197;
  ushort uVar201;
  ushort uVar206;
  byte bVar211;
  ushort uVar209;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  ushort uVar170;
  undefined1 auVar177 [16];
  ushort uVar184;
  undefined1 auVar178 [16];
  ushort uVar171;
  ushort uVar185;
  ushort uVar202;
  ushort uVar210;
  undefined1 auVar179 [16];
  ushort uVar212;
  ushort uVar213;
  short sVar216;
  ushort uVar217;
  short sVar218;
  short sVar219;
  short sVar220;
  ushort uVar221;
  short sVar222;
  short sVar223;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  short sVar224;
  ushort uVar226;
  ushort uVar227;
  ushort uVar228;
  undefined1 auVar225 [16];
  ushort uVar229;
  ushort uVar230;
  byte bVar231;
  byte bVar234;
  ushort uVar232;
  byte bVar235;
  byte bVar236;
  byte bVar237;
  byte bVar238;
  byte bVar239;
  byte bVar240;
  byte bVar241;
  byte bVar242;
  byte bVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  undefined1 auVar233 [16];
  byte bVar248;
  ushort uVar249;
  ushort uVar259;
  ushort uVar261;
  ushort uVar263;
  ushort uVar265;
  ushort uVar268;
  ushort uVar271;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  ushort uVar250;
  ushort uVar260;
  ushort uVar262;
  ushort uVar264;
  ushort uVar266;
  ushort uVar269;
  ushort uVar272;
  ushort uVar273;
  undefined1 auVar257 [16];
  ushort uVar251;
  ushort uVar252;
  ushort uVar253;
  ushort uVar267;
  ushort uVar270;
  undefined1 auVar258 [16];
  ushort uVar274;
  short sVar275;
  short sVar276;
  short sVar277;
  short sVar278;
  short sVar279;
  short sVar280;
  ushort uVar281;
  short sVar282;
  short sVar283;
  short sVar284;
  short sVar285;
  short sVar286;
  short sVar287;
  short sVar288;
  short sVar289;
  short sVar290;
  short sVar291;
  short sVar292;
  byte bVar293;
  byte bVar295;
  ushort uVar294;
  byte bVar296;
  byte bVar297;
  byte bVar298;
  byte bVar299;
  byte bVar300;
  byte bVar301;
  byte bVar302;
  byte bVar303;
  byte bVar304;
  byte bVar305;
  byte bVar306;
  byte bVar307;
  byte bVar308;
  byte bVar309;
  byte bVar310;
  ushort uVar311;
  short sVar315;
  short sVar316;
  ushort uVar317;
  short sVar318;
  short sVar319;
  short sVar320;
  short sVar321;
  ushort uVar322;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  ushort uVar323;
  ushort uVar324;
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  ushort uVar327;
  undefined1 auVar328 [16];
  ushort uVar329;
  ushort uVar330;
  ushort uVar332;
  short sVar333;
  short sVar334;
  ushort uVar335;
  short sVar336;
  short sVar337;
  ushort uVar338;
  short sVar339;
  short sVar340;
  ushort uVar341;
  short sVar342;
  short sVar343;
  ushort uVar344;
  short sVar345;
  short sVar346;
  ushort uVar347;
  short sVar348;
  undefined1 auVar331 [16];
  short sVar349;
  ushort uVar350;
  ushort uVar351;
  ushort uVar352;
  ushort uVar353;
  ushort uVar354;
  ushort uVar355;
  ushort uVar356;
  ushort uVar357;
  ushort uVar358;
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  ushort uVar362;
  undefined1 auVar363 [16];
  ushort uVar365;
  undefined1 auVar364 [16];
  ushort uVar366;
  ushort uVar367;
  ushort uVar368;
  ushort uVar369;
  short sVar370;
  ushort uVar371;
  short sVar372;
  ushort uVar373;
  short sVar374;
  ushort uVar375;
  short sVar376;
  ushort uVar377;
  short sVar378;
  ushort uVar379;
  short sVar380;
  ushort uVar381;
  short sVar382;
  ushort uVar383;
  ushort uVar384;
  ushort uStack_2d6;
  ushort uStack_2d4;
  ushort uStack_2d2;
  ushort uStack_2d0;
  ushort uStack_2ce;
  ushort uStack_2cc;
  ushort uStack_2ca;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  short sStack_2b6;
  short sStack_2b4;
  short sStack_2b2;
  short sStack_2b0;
  short sStack_2ae;
  short sStack_2ac;
  ushort uStack_2a6;
  ushort uStack_2a4;
  ushort uStack_2a2;
  undefined2 uStack_2a0;
  undefined2 uStack_29e;
  undefined2 uStack_29c;
  undefined2 uStack_29a;
  short sStack_276;
  short sStack_274;
  short sStack_272;
  short sStack_270;
  short sStack_26e;
  short sStack_26c;
  short sStack_266;
  short sStack_264;
  short sStack_262;
  short sStack_260;
  short sStack_25e;
  short sStack_25c;
  ushort uStack_256;
  ushort uStack_254;
  ushort uStack_252;
  ushort uStack_250;
  ushort uStack_24e;
  ushort uStack_24c;
  ushort uStack_24a;
  undefined8 local_248;
  undefined8 uStack_240;
  ushort uStack_216;
  ushort uStack_214;
  ushort uStack_212;
  ushort uStack_210;
  ushort uStack_20e;
  ushort uStack_20c;
  ushort uStack_20a;
  ushort uStack_206;
  ushort uStack_204;
  ushort uStack_202;
  ushort uStack_200;
  ushort uStack_1fe;
  ushort uStack_1fc;
  ushort uStack_1fa;
  undefined1 local_1d8 [16];
  ushort uStack_1c6;
  ushort uStack_1c4;
  ushort uStack_1c2;
  ushort uStack_1c0;
  ushort uStack_1be;
  ushort uStack_1bc;
  ushort uStack_1ba;
  ushort uStack_1a6;
  ushort uStack_1a4;
  ushort uStack_1a2;
  ushort uStack_1a0;
  ushort uStack_19e;
  ushort uStack_19c;
  ushort uStack_19a;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ushort uStack_166;
  ushort uStack_164;
  ushort uStack_162;
  ushort uStack_160;
  ushort uStack_15e;
  ushort uStack_15c;
  ushort uStack_15a;
  ushort uStack_156;
  ushort uStack_154;
  ushort uStack_152;
  ushort uStack_150;
  ushort uStack_14e;
  ushort uStack_14c;
  ushort uStack_14a;
  ushort uStack_136;
  ushort uStack_134;
  ushort uStack_132;
  ushort uStack_130;
  ushort uStack_12e;
  ushort uStack_12c;
  ushort uStack_12a;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  short sStack_e6;
  short sStack_e4;
  short sStack_e2;
  short sStack_e0;
  short sStack_de;
  short sStack_dc;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  short sStack_86;
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  
  lVar166 = (long)p;
  auVar176 = *(undefined1 (*) [16])(s + lVar166 * -4);
  auVar177 = *(undefined1 (*) [16])(s + lVar166 * -3);
  auVar178 = *(undefined1 (*) [16])(s + lVar166 * -2);
  auVar179 = *(undefined1 (*) [16])(s + -lVar166);
  auVar173 = *(undefined1 (*) [16])s;
  auVar174 = *(undefined1 (*) [16])(s + lVar166);
  auVar175 = *(undefined1 (*) [16])(s + lVar166 * 2);
  auVar326 = *(undefined1 (*) [16])(s + lVar166 * 3);
  auVar172 = psubusb(auVar178,auVar179);
  auVar225 = psubusb(auVar179,auVar178);
  auVar225 = auVar225 | auVar172;
  auVar233 = psubusb(auVar174,auVar173);
  auVar172 = psubusb(auVar173,auVar174);
  auVar172 = auVar172 | auVar233;
  bVar309 = auVar225[0];
  bVar231 = auVar172[0];
  bVar167 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[1];
  bVar231 = auVar172[1];
  bVar180 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[2];
  bVar231 = auVar172[2];
  bVar181 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[3];
  bVar231 = auVar172[3];
  bVar186 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[4];
  bVar231 = auVar172[4];
  bVar187 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[5];
  bVar231 = auVar172[5];
  bVar190 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[6];
  bVar231 = auVar172[6];
  bVar191 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[7];
  bVar231 = auVar172[7];
  bVar194 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[8];
  bVar231 = auVar172[8];
  bVar195 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[9];
  bVar231 = auVar172[9];
  bVar198 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[10];
  bVar231 = auVar172[10];
  bVar199 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[0xb];
  bVar231 = auVar172[0xb];
  bVar203 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[0xc];
  bVar231 = auVar172[0xc];
  bVar204 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[0xd];
  bVar231 = auVar172[0xd];
  bVar207 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[0xe];
  bVar231 = auVar172[0xe];
  bVar234 = auVar172[0xf];
  bVar208 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[0xf];
  bVar211 = (bVar234 < bVar309) * bVar309 | (bVar234 >= bVar309) * bVar234;
  auVar172 = psubusb(auVar179,auVar173);
  auVar233 = psubusb(auVar173,auVar179);
  auVar225 = psubusb(auVar178,auVar174);
  auVar254 = psubusb(auVar174,auVar178);
  auVar254 = auVar254 | auVar225;
  auVar172 = paddusb(auVar233 | auVar172,auVar233 | auVar172);
  auVar225._0_2_ = auVar254._0_2_ >> 1;
  auVar225._2_2_ = auVar254._2_2_ >> 1;
  auVar225._4_2_ = auVar254._4_2_ >> 1;
  auVar225._6_2_ = auVar254._6_2_ >> 1;
  auVar225._8_2_ = auVar254._8_2_ >> 1;
  auVar225._10_2_ = auVar254._10_2_ >> 1;
  auVar225._12_2_ = auVar254._12_2_ >> 1;
  auVar225._14_2_ = auVar254._14_2_ >> 1;
  auVar172 = paddusb(auVar225 & _DAT_004d8200,auVar172);
  bVar248 = *_blimit0;
  bVar293 = _blimit0[1];
  bVar295 = _blimit0[2];
  bVar296 = _blimit0[3];
  bVar297 = _blimit0[4];
  bVar298 = _blimit0[5];
  bVar299 = _blimit0[6];
  bVar300 = _blimit0[7];
  bVar301 = _blimit0[8];
  bVar302 = _blimit0[9];
  bVar303 = _blimit0[10];
  bVar304 = _blimit0[0xb];
  bVar305 = _blimit0[0xc];
  bVar306 = _blimit0[0xd];
  bVar307 = _blimit0[0xe];
  bVar308 = _blimit0[0xf];
  bVar309 = auVar172[0];
  bVar231 = auVar172[1];
  bVar234 = auVar172[2];
  bVar235 = auVar172[3];
  bVar236 = auVar172[4];
  bVar237 = auVar172[5];
  bVar238 = auVar172[6];
  bVar239 = auVar172[7];
  bVar240 = auVar172[8];
  bVar241 = auVar172[9];
  bVar242 = auVar172[10];
  bVar243 = auVar172[0xb];
  bVar244 = auVar172[0xc];
  bVar245 = auVar172[0xd];
  bVar246 = auVar172[0xe];
  bVar247 = auVar172[0xf];
  bVar309 = -((byte)((bVar309 < bVar248) * bVar309 | (bVar309 >= bVar248) * bVar248) == bVar309) ^
            0xff;
  bVar248 = -((byte)((bVar231 < bVar293) * bVar231 | (bVar231 >= bVar293) * bVar293) == bVar231) ^
            0xff;
  bVar293 = -((byte)((bVar234 < bVar295) * bVar234 | (bVar234 >= bVar295) * bVar295) == bVar234) ^
            0xff;
  bVar295 = -((byte)((bVar235 < bVar296) * bVar235 | (bVar235 >= bVar296) * bVar296) == bVar235) ^
            0xff;
  bVar296 = -((byte)((bVar236 < bVar297) * bVar236 | (bVar236 >= bVar297) * bVar297) == bVar236) ^
            0xff;
  bVar297 = -((byte)((bVar237 < bVar298) * bVar237 | (bVar237 >= bVar298) * bVar298) == bVar237) ^
            0xff;
  bVar298 = -((byte)((bVar238 < bVar299) * bVar238 | (bVar238 >= bVar299) * bVar299) == bVar238) ^
            0xff;
  bVar299 = -((byte)((bVar239 < bVar300) * bVar239 | (bVar239 >= bVar300) * bVar300) == bVar239) ^
            0xff;
  bVar300 = -((byte)((bVar240 < bVar301) * bVar240 | (bVar240 >= bVar301) * bVar301) == bVar240) ^
            0xff;
  bVar301 = -((byte)((bVar241 < bVar302) * bVar241 | (bVar241 >= bVar302) * bVar302) == bVar241) ^
            0xff;
  bVar302 = -((byte)((bVar242 < bVar303) * bVar242 | (bVar242 >= bVar303) * bVar303) == bVar242) ^
            0xff;
  bVar303 = -((byte)((bVar243 < bVar304) * bVar243 | (bVar243 >= bVar304) * bVar304) == bVar243) ^
            0xff;
  bVar304 = -((byte)((bVar244 < bVar305) * bVar244 | (bVar244 >= bVar305) * bVar305) == bVar244) ^
            0xff;
  bVar305 = -((byte)((bVar245 < bVar306) * bVar245 | (bVar245 >= bVar306) * bVar306) == bVar245) ^
            0xff;
  bVar306 = -((byte)((bVar246 < bVar307) * bVar246 | (bVar246 >= bVar307) * bVar307) == bVar246) ^
            0xff;
  bVar307 = -((byte)((bVar247 < bVar308) * bVar247 | (bVar247 >= bVar308) * bVar308) == bVar247) ^
            0xff;
  bVar231 = (bVar309 < bVar167) * bVar167 | (bVar309 >= bVar167) * bVar309;
  bVar234 = (bVar248 < bVar180) * bVar180 | (bVar248 >= bVar180) * bVar248;
  bVar235 = (bVar293 < bVar181) * bVar181 | (bVar293 >= bVar181) * bVar293;
  bVar236 = (bVar295 < bVar186) * bVar186 | (bVar295 >= bVar186) * bVar295;
  bVar237 = (bVar296 < bVar187) * bVar187 | (bVar296 >= bVar187) * bVar296;
  bVar238 = (bVar297 < bVar190) * bVar190 | (bVar297 >= bVar190) * bVar297;
  bVar239 = (bVar298 < bVar191) * bVar191 | (bVar298 >= bVar191) * bVar298;
  bVar240 = (bVar299 < bVar194) * bVar194 | (bVar299 >= bVar194) * bVar299;
  bVar241 = (bVar300 < bVar195) * bVar195 | (bVar300 >= bVar195) * bVar300;
  bVar242 = (bVar301 < bVar198) * bVar198 | (bVar301 >= bVar198) * bVar301;
  bVar243 = (bVar302 < bVar199) * bVar199 | (bVar302 >= bVar199) * bVar302;
  bVar244 = (bVar303 < bVar203) * bVar203 | (bVar303 >= bVar203) * bVar303;
  bVar245 = (bVar304 < bVar204) * bVar204 | (bVar304 >= bVar204) * bVar304;
  bVar246 = (bVar305 < bVar207) * bVar207 | (bVar305 >= bVar207) * bVar305;
  bVar247 = (bVar306 < bVar208) * bVar208 | (bVar306 >= bVar208) * bVar306;
  bVar248 = (bVar307 < bVar211) * bVar211 | (bVar307 >= bVar211) * bVar307;
  auVar172 = psubusb(auVar177,auVar178);
  auVar225 = psubusb(auVar178,auVar177);
  auVar225 = auVar225 | auVar172;
  auVar172 = psubusb(auVar176,auVar177);
  auVar233 = psubusb(auVar177,auVar176);
  auVar233 = auVar233 | auVar172;
  bVar309 = auVar225[0];
  bVar293 = auVar233[0];
  bVar293 = (bVar293 < bVar309) * bVar309 | (bVar293 >= bVar309) * bVar293;
  bVar309 = auVar225[1];
  bVar295 = auVar233[1];
  bVar295 = (bVar295 < bVar309) * bVar309 | (bVar295 >= bVar309) * bVar295;
  bVar309 = auVar225[2];
  bVar296 = auVar233[2];
  bVar296 = (bVar296 < bVar309) * bVar309 | (bVar296 >= bVar309) * bVar296;
  bVar309 = auVar225[3];
  bVar297 = auVar233[3];
  bVar297 = (bVar297 < bVar309) * bVar309 | (bVar297 >= bVar309) * bVar297;
  bVar309 = auVar225[4];
  bVar298 = auVar233[4];
  bVar298 = (bVar298 < bVar309) * bVar309 | (bVar298 >= bVar309) * bVar298;
  bVar309 = auVar225[5];
  bVar299 = auVar233[5];
  bVar299 = (bVar299 < bVar309) * bVar309 | (bVar299 >= bVar309) * bVar299;
  bVar309 = auVar225[6];
  bVar300 = auVar233[6];
  bVar300 = (bVar300 < bVar309) * bVar309 | (bVar300 >= bVar309) * bVar300;
  bVar309 = auVar225[7];
  bVar301 = auVar233[7];
  bVar301 = (bVar301 < bVar309) * bVar309 | (bVar301 >= bVar309) * bVar301;
  bVar309 = auVar225[8];
  bVar302 = auVar233[8];
  bVar302 = (bVar302 < bVar309) * bVar309 | (bVar302 >= bVar309) * bVar302;
  bVar309 = auVar225[9];
  bVar303 = auVar233[9];
  bVar303 = (bVar303 < bVar309) * bVar309 | (bVar303 >= bVar309) * bVar303;
  bVar309 = auVar225[10];
  bVar304 = auVar233[10];
  bVar304 = (bVar304 < bVar309) * bVar309 | (bVar304 >= bVar309) * bVar304;
  bVar309 = auVar225[0xb];
  bVar305 = auVar233[0xb];
  bVar305 = (bVar305 < bVar309) * bVar309 | (bVar305 >= bVar309) * bVar305;
  bVar309 = auVar225[0xc];
  bVar306 = auVar233[0xc];
  bVar306 = (bVar306 < bVar309) * bVar309 | (bVar306 >= bVar309) * bVar306;
  bVar309 = auVar225[0xd];
  bVar307 = auVar233[0xd];
  bVar307 = (bVar307 < bVar309) * bVar309 | (bVar307 >= bVar309) * bVar307;
  bVar309 = auVar225[0xe];
  bVar308 = auVar233[0xe];
  bVar310 = auVar233[0xf];
  bVar308 = (bVar308 < bVar309) * bVar309 | (bVar308 >= bVar309) * bVar308;
  bVar309 = auVar225[0xf];
  bVar309 = (bVar310 < bVar309) * bVar309 | (bVar310 >= bVar309) * bVar310;
  bVar293 = (bVar293 < bVar231) * bVar231 | (bVar293 >= bVar231) * bVar293;
  bVar295 = (bVar295 < bVar234) * bVar234 | (bVar295 >= bVar234) * bVar295;
  bVar296 = (bVar296 < bVar235) * bVar235 | (bVar296 >= bVar235) * bVar296;
  bVar297 = (bVar297 < bVar236) * bVar236 | (bVar297 >= bVar236) * bVar297;
  bVar298 = (bVar298 < bVar237) * bVar237 | (bVar298 >= bVar237) * bVar298;
  bVar299 = (bVar299 < bVar238) * bVar238 | (bVar299 >= bVar238) * bVar299;
  bVar300 = (bVar300 < bVar239) * bVar239 | (bVar300 >= bVar239) * bVar300;
  bVar301 = (bVar301 < bVar240) * bVar240 | (bVar301 >= bVar240) * bVar301;
  bVar302 = (bVar302 < bVar241) * bVar241 | (bVar302 >= bVar241) * bVar302;
  bVar303 = (bVar303 < bVar242) * bVar242 | (bVar303 >= bVar242) * bVar303;
  bVar304 = (bVar304 < bVar243) * bVar243 | (bVar304 >= bVar243) * bVar304;
  bVar305 = (bVar305 < bVar244) * bVar244 | (bVar305 >= bVar244) * bVar305;
  bVar306 = (bVar306 < bVar245) * bVar245 | (bVar306 >= bVar245) * bVar306;
  bVar307 = (bVar307 < bVar246) * bVar246 | (bVar307 >= bVar246) * bVar307;
  bVar308 = (bVar308 < bVar247) * bVar247 | (bVar308 >= bVar247) * bVar308;
  bVar310 = (bVar309 < bVar248) * bVar248 | (bVar309 >= bVar248) * bVar309;
  auVar172 = psubusb(auVar175,auVar174);
  auVar225 = psubusb(auVar174,auVar175);
  auVar225 = auVar225 | auVar172;
  auVar172 = psubusb(auVar326,auVar175);
  auVar233 = psubusb(auVar175,auVar326);
  auVar233 = auVar233 | auVar172;
  bVar309 = auVar225[0];
  bVar231 = auVar233[0];
  bVar231 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
  bVar309 = auVar225[1];
  bVar234 = auVar233[1];
  bVar234 = (bVar234 < bVar309) * bVar309 | (bVar234 >= bVar309) * bVar234;
  bVar309 = auVar225[2];
  bVar235 = auVar233[2];
  bVar235 = (bVar235 < bVar309) * bVar309 | (bVar235 >= bVar309) * bVar235;
  bVar309 = auVar225[3];
  bVar236 = auVar233[3];
  bVar236 = (bVar236 < bVar309) * bVar309 | (bVar236 >= bVar309) * bVar236;
  bVar309 = auVar225[4];
  bVar237 = auVar233[4];
  bVar237 = (bVar237 < bVar309) * bVar309 | (bVar237 >= bVar309) * bVar237;
  bVar309 = auVar225[5];
  bVar238 = auVar233[5];
  bVar238 = (bVar238 < bVar309) * bVar309 | (bVar238 >= bVar309) * bVar238;
  bVar309 = auVar225[6];
  bVar239 = auVar233[6];
  bVar239 = (bVar239 < bVar309) * bVar309 | (bVar239 >= bVar309) * bVar239;
  bVar309 = auVar225[7];
  bVar240 = auVar233[7];
  bVar240 = (bVar240 < bVar309) * bVar309 | (bVar240 >= bVar309) * bVar240;
  bVar309 = auVar225[8];
  bVar241 = auVar233[8];
  bVar241 = (bVar241 < bVar309) * bVar309 | (bVar241 >= bVar309) * bVar241;
  bVar309 = auVar225[9];
  bVar242 = auVar233[9];
  bVar242 = (bVar242 < bVar309) * bVar309 | (bVar242 >= bVar309) * bVar242;
  bVar309 = auVar225[10];
  bVar243 = auVar233[10];
  bVar243 = (bVar243 < bVar309) * bVar309 | (bVar243 >= bVar309) * bVar243;
  bVar309 = auVar225[0xb];
  bVar244 = auVar233[0xb];
  bVar244 = (bVar244 < bVar309) * bVar309 | (bVar244 >= bVar309) * bVar244;
  bVar309 = auVar225[0xc];
  bVar245 = auVar233[0xc];
  bVar245 = (bVar245 < bVar309) * bVar309 | (bVar245 >= bVar309) * bVar245;
  bVar309 = auVar225[0xd];
  bVar246 = auVar233[0xd];
  bVar246 = (bVar246 < bVar309) * bVar309 | (bVar246 >= bVar309) * bVar246;
  bVar309 = auVar225[0xe];
  bVar247 = auVar233[0xe];
  bVar248 = auVar233[0xf];
  bVar247 = (bVar247 < bVar309) * bVar309 | (bVar247 >= bVar309) * bVar247;
  bVar309 = auVar225[0xf];
  bVar309 = (bVar248 < bVar309) * bVar309 | (bVar248 >= bVar309) * bVar248;
  bVar248 = (bVar231 < bVar293) * bVar293 | (bVar231 >= bVar293) * bVar231;
  bVar293 = (bVar234 < bVar295) * bVar295 | (bVar234 >= bVar295) * bVar234;
  bVar295 = (bVar235 < bVar296) * bVar296 | (bVar235 >= bVar296) * bVar235;
  bVar296 = (bVar236 < bVar297) * bVar297 | (bVar236 >= bVar297) * bVar236;
  bVar297 = (bVar237 < bVar298) * bVar298 | (bVar237 >= bVar298) * bVar237;
  bVar298 = (bVar238 < bVar299) * bVar299 | (bVar238 >= bVar299) * bVar238;
  bVar299 = (bVar239 < bVar300) * bVar300 | (bVar239 >= bVar300) * bVar239;
  bVar300 = (bVar240 < bVar301) * bVar301 | (bVar240 >= bVar301) * bVar240;
  bVar301 = (bVar241 < bVar302) * bVar302 | (bVar241 >= bVar302) * bVar241;
  bVar302 = (bVar242 < bVar303) * bVar303 | (bVar242 >= bVar303) * bVar242;
  bVar303 = (bVar243 < bVar304) * bVar304 | (bVar243 >= bVar304) * bVar243;
  bVar304 = (bVar244 < bVar305) * bVar305 | (bVar244 >= bVar305) * bVar244;
  bVar305 = (bVar245 < bVar306) * bVar306 | (bVar245 >= bVar306) * bVar245;
  bVar306 = (bVar246 < bVar307) * bVar307 | (bVar246 >= bVar307) * bVar246;
  bVar307 = (bVar247 < bVar308) * bVar308 | (bVar247 >= bVar308) * bVar247;
  bVar308 = (bVar309 < bVar310) * bVar310 | (bVar309 >= bVar310) * bVar309;
  bVar309 = *_limit0;
  bVar231 = _limit0[1];
  bVar234 = _limit0[2];
  bVar235 = _limit0[3];
  bVar236 = _limit0[4];
  bVar237 = _limit0[5];
  bVar238 = _limit0[6];
  bVar239 = _limit0[7];
  bVar240 = _limit0[8];
  bVar241 = _limit0[9];
  bVar242 = _limit0[10];
  bVar243 = _limit0[0xb];
  bVar244 = _limit0[0xc];
  bVar245 = _limit0[0xd];
  bVar246 = _limit0[0xe];
  bVar247 = _limit0[0xf];
  auVar172[0] = -((byte)((bVar248 < bVar309) * bVar248 | (bVar248 >= bVar309) * bVar309) == bVar248)
  ;
  auVar172[1] = -((byte)((bVar293 < bVar231) * bVar293 | (bVar293 >= bVar231) * bVar231) == bVar293)
  ;
  auVar172[2] = -((byte)((bVar295 < bVar234) * bVar295 | (bVar295 >= bVar234) * bVar234) == bVar295)
  ;
  auVar172[3] = -((byte)((bVar296 < bVar235) * bVar296 | (bVar296 >= bVar235) * bVar235) == bVar296)
  ;
  auVar172[4] = -((byte)((bVar297 < bVar236) * bVar297 | (bVar297 >= bVar236) * bVar236) == bVar297)
  ;
  auVar172[5] = -((byte)((bVar298 < bVar237) * bVar298 | (bVar298 >= bVar237) * bVar237) == bVar298)
  ;
  auVar172[6] = -((byte)((bVar299 < bVar238) * bVar299 | (bVar299 >= bVar238) * bVar238) == bVar299)
  ;
  auVar172[7] = -((byte)((bVar300 < bVar239) * bVar300 | (bVar300 >= bVar239) * bVar239) == bVar300)
  ;
  auVar172[8] = -((byte)((bVar301 < bVar240) * bVar301 | (bVar301 >= bVar240) * bVar240) == bVar301)
  ;
  auVar172[9] = -((byte)((bVar302 < bVar241) * bVar302 | (bVar302 >= bVar241) * bVar241) == bVar302)
  ;
  auVar172[10] = -((byte)((bVar303 < bVar242) * bVar303 | (bVar303 >= bVar242) * bVar242) == bVar303
                  );
  auVar172[0xb] =
       -((byte)((bVar304 < bVar243) * bVar304 | (bVar304 >= bVar243) * bVar243) == bVar304);
  auVar172[0xc] =
       -((byte)((bVar305 < bVar244) * bVar305 | (bVar305 >= bVar244) * bVar244) == bVar305);
  auVar172[0xd] =
       -((byte)((bVar306 < bVar245) * bVar306 | (bVar306 >= bVar245) * bVar245) == bVar306);
  auVar172[0xe] =
       -((byte)((bVar307 < bVar246) * bVar307 | (bVar307 >= bVar246) * bVar246) == bVar307);
  bVar1 = (byte)((bVar308 < bVar247) * bVar308 | (bVar308 >= bVar247) * bVar247) == bVar308;
  auVar172[0xf] = -bVar1;
  if ((((((((((((((((auVar172 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar172 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar172 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar172 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar172 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar172 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar172 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar172 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar172 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar172 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar172 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar172 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar172 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar172 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar172 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || bVar1) {
    auVar225 = psubusb(auVar177,auVar179);
    auVar233 = psubusb(auVar179,auVar177);
    auVar233 = auVar233 | auVar225;
    auVar225 = psubusb(auVar175,auVar173);
    auVar254 = psubusb(auVar173,auVar175);
    auVar254 = auVar254 | auVar225;
    bVar309 = auVar233[0];
    bVar231 = auVar254[0];
    bVar231 = (bVar231 < bVar309) * bVar309 | (bVar231 >= bVar309) * bVar231;
    bVar309 = auVar233[1];
    bVar234 = auVar254[1];
    bVar234 = (bVar234 < bVar309) * bVar309 | (bVar234 >= bVar309) * bVar234;
    bVar309 = auVar233[2];
    bVar235 = auVar254[2];
    bVar235 = (bVar235 < bVar309) * bVar309 | (bVar235 >= bVar309) * bVar235;
    bVar309 = auVar233[3];
    bVar236 = auVar254[3];
    bVar236 = (bVar236 < bVar309) * bVar309 | (bVar236 >= bVar309) * bVar236;
    bVar309 = auVar233[4];
    bVar237 = auVar254[4];
    bVar237 = (bVar237 < bVar309) * bVar309 | (bVar237 >= bVar309) * bVar237;
    bVar309 = auVar233[5];
    bVar238 = auVar254[5];
    bVar238 = (bVar238 < bVar309) * bVar309 | (bVar238 >= bVar309) * bVar238;
    bVar309 = auVar233[6];
    bVar239 = auVar254[6];
    bVar239 = (bVar239 < bVar309) * bVar309 | (bVar239 >= bVar309) * bVar239;
    bVar309 = auVar233[7];
    bVar240 = auVar254[7];
    bVar240 = (bVar240 < bVar309) * bVar309 | (bVar240 >= bVar309) * bVar240;
    bVar309 = auVar233[8];
    bVar241 = auVar254[8];
    bVar241 = (bVar241 < bVar309) * bVar309 | (bVar241 >= bVar309) * bVar241;
    bVar309 = auVar233[9];
    bVar242 = auVar254[9];
    bVar242 = (bVar242 < bVar309) * bVar309 | (bVar242 >= bVar309) * bVar242;
    bVar309 = auVar233[10];
    bVar243 = auVar254[10];
    bVar243 = (bVar243 < bVar309) * bVar309 | (bVar243 >= bVar309) * bVar243;
    bVar309 = auVar233[0xb];
    bVar244 = auVar254[0xb];
    bVar244 = (bVar244 < bVar309) * bVar309 | (bVar244 >= bVar309) * bVar244;
    bVar309 = auVar233[0xc];
    bVar245 = auVar254[0xc];
    bVar245 = (bVar245 < bVar309) * bVar309 | (bVar245 >= bVar309) * bVar245;
    bVar309 = auVar233[0xd];
    bVar246 = auVar254[0xd];
    bVar246 = (bVar246 < bVar309) * bVar309 | (bVar246 >= bVar309) * bVar246;
    bVar309 = auVar233[0xe];
    bVar247 = auVar254[0xe];
    bVar248 = auVar254[0xf];
    bVar247 = (bVar247 < bVar309) * bVar309 | (bVar247 >= bVar309) * bVar247;
    bVar309 = auVar233[0xf];
    bVar309 = (bVar248 < bVar309) * bVar309 | (bVar248 >= bVar309) * bVar248;
    bVar231 = (bVar231 < bVar167) * bVar167 | (bVar231 >= bVar167) * bVar231;
    bVar234 = (bVar234 < bVar180) * bVar180 | (bVar234 >= bVar180) * bVar234;
    bVar235 = (bVar235 < bVar181) * bVar181 | (bVar235 >= bVar181) * bVar235;
    bVar236 = (bVar236 < bVar186) * bVar186 | (bVar236 >= bVar186) * bVar236;
    bVar237 = (bVar237 < bVar187) * bVar187 | (bVar237 >= bVar187) * bVar237;
    bVar238 = (bVar238 < bVar190) * bVar190 | (bVar238 >= bVar190) * bVar238;
    bVar239 = (bVar239 < bVar191) * bVar191 | (bVar239 >= bVar191) * bVar239;
    bVar240 = (bVar240 < bVar194) * bVar194 | (bVar240 >= bVar194) * bVar240;
    bVar241 = (bVar241 < bVar195) * bVar195 | (bVar241 >= bVar195) * bVar241;
    bVar242 = (bVar242 < bVar198) * bVar198 | (bVar242 >= bVar198) * bVar242;
    bVar243 = (bVar243 < bVar199) * bVar199 | (bVar243 >= bVar199) * bVar243;
    bVar244 = (bVar244 < bVar203) * bVar203 | (bVar244 >= bVar203) * bVar244;
    bVar245 = (bVar245 < bVar204) * bVar204 | (bVar245 >= bVar204) * bVar245;
    bVar246 = (bVar246 < bVar207) * bVar207 | (bVar246 >= bVar207) * bVar246;
    bVar247 = (bVar247 < bVar208) * bVar208 | (bVar247 >= bVar208) * bVar247;
    bVar248 = (bVar309 < bVar211) * bVar211 | (bVar309 >= bVar211) * bVar309;
    auVar225 = psubusb(auVar176,auVar179);
    auVar233 = psubusb(auVar179,auVar176);
    auVar233 = auVar233 | auVar225;
    auVar225 = psubusb(auVar326,auVar173);
    auVar254 = psubusb(auVar173,auVar326);
    auVar254 = auVar254 | auVar225;
    bVar309 = auVar233[0];
    bVar293 = auVar254[0];
    bVar293 = (bVar293 < bVar309) * bVar309 | (bVar293 >= bVar309) * bVar293;
    bVar309 = auVar233[1];
    bVar295 = auVar254[1];
    bVar295 = (bVar295 < bVar309) * bVar309 | (bVar295 >= bVar309) * bVar295;
    bVar309 = auVar233[2];
    bVar296 = auVar254[2];
    bVar296 = (bVar296 < bVar309) * bVar309 | (bVar296 >= bVar309) * bVar296;
    bVar309 = auVar233[3];
    bVar297 = auVar254[3];
    bVar297 = (bVar297 < bVar309) * bVar309 | (bVar297 >= bVar309) * bVar297;
    bVar309 = auVar233[4];
    bVar298 = auVar254[4];
    bVar298 = (bVar298 < bVar309) * bVar309 | (bVar298 >= bVar309) * bVar298;
    bVar309 = auVar233[5];
    bVar299 = auVar254[5];
    bVar299 = (bVar299 < bVar309) * bVar309 | (bVar299 >= bVar309) * bVar299;
    bVar309 = auVar233[6];
    bVar300 = auVar254[6];
    bVar300 = (bVar300 < bVar309) * bVar309 | (bVar300 >= bVar309) * bVar300;
    bVar309 = auVar233[7];
    bVar301 = auVar254[7];
    bVar301 = (bVar301 < bVar309) * bVar309 | (bVar301 >= bVar309) * bVar301;
    bVar309 = auVar233[8];
    bVar302 = auVar254[8];
    bVar302 = (bVar302 < bVar309) * bVar309 | (bVar302 >= bVar309) * bVar302;
    bVar309 = auVar233[9];
    bVar303 = auVar254[9];
    bVar303 = (bVar303 < bVar309) * bVar309 | (bVar303 >= bVar309) * bVar303;
    bVar309 = auVar233[10];
    bVar304 = auVar254[10];
    bVar304 = (bVar304 < bVar309) * bVar309 | (bVar304 >= bVar309) * bVar304;
    bVar309 = auVar233[0xb];
    bVar305 = auVar254[0xb];
    bVar305 = (bVar305 < bVar309) * bVar309 | (bVar305 >= bVar309) * bVar305;
    bVar309 = auVar233[0xc];
    bVar306 = auVar254[0xc];
    bVar306 = (bVar306 < bVar309) * bVar309 | (bVar306 >= bVar309) * bVar306;
    bVar309 = auVar233[0xd];
    bVar307 = auVar254[0xd];
    bVar307 = (bVar307 < bVar309) * bVar309 | (bVar307 >= bVar309) * bVar307;
    bVar309 = auVar233[0xe];
    bVar308 = auVar254[0xe];
    bVar310 = auVar254[0xf];
    bVar308 = (bVar308 < bVar309) * bVar309 | (bVar308 >= bVar309) * bVar308;
    bVar309 = auVar233[0xf];
    bVar309 = (bVar310 < bVar309) * bVar309 | (bVar310 >= bVar309) * bVar310;
    bVar293 = (bVar293 < bVar231) * bVar231 | (bVar293 >= bVar231) * bVar293;
    bVar295 = (bVar295 < bVar234) * bVar234 | (bVar295 >= bVar234) * bVar295;
    bVar296 = (bVar296 < bVar235) * bVar235 | (bVar296 >= bVar235) * bVar296;
    bVar297 = (bVar297 < bVar236) * bVar236 | (bVar297 >= bVar236) * bVar297;
    bVar298 = (bVar298 < bVar237) * bVar237 | (bVar298 >= bVar237) * bVar298;
    bVar299 = (bVar299 < bVar238) * bVar238 | (bVar299 >= bVar238) * bVar299;
    bVar300 = (bVar300 < bVar239) * bVar239 | (bVar300 >= bVar239) * bVar300;
    bVar301 = (bVar301 < bVar240) * bVar240 | (bVar301 >= bVar240) * bVar301;
    bVar302 = (bVar302 < bVar241) * bVar241 | (bVar302 >= bVar241) * bVar302;
    bVar303 = (bVar303 < bVar242) * bVar242 | (bVar303 >= bVar242) * bVar303;
    bVar304 = (bVar304 < bVar243) * bVar243 | (bVar304 >= bVar243) * bVar304;
    bVar305 = (bVar305 < bVar244) * bVar244 | (bVar305 >= bVar244) * bVar305;
    bVar306 = (bVar306 < bVar245) * bVar245 | (bVar306 >= bVar245) * bVar306;
    bVar307 = (bVar307 < bVar246) * bVar246 | (bVar307 >= bVar246) * bVar307;
    bVar308 = (bVar308 < bVar247) * bVar247 | (bVar308 >= bVar247) * bVar308;
    bVar248 = (bVar309 < bVar248) * bVar248 | (bVar309 >= bVar248) * bVar309;
    bVar309 = DAT_004d81f0;
    bVar231 = DAT_004d81f0._1_1_;
    bVar234 = DAT_004d81f0._2_1_;
    bVar235 = DAT_004d81f0._3_1_;
    bVar236 = DAT_004d81f0._4_1_;
    bVar237 = DAT_004d81f0._5_1_;
    bVar238 = DAT_004d81f0._6_1_;
    bVar239 = DAT_004d81f0._7_1_;
    bVar240 = DAT_004d81f0._8_1_;
    bVar241 = DAT_004d81f0._9_1_;
    bVar242 = DAT_004d81f0._10_1_;
    bVar243 = DAT_004d81f0._11_1_;
    bVar244 = DAT_004d81f0._12_1_;
    bVar245 = DAT_004d81f0._13_1_;
    bVar246 = DAT_004d81f0._14_1_;
    bVar247 = DAT_004d81f0._15_1_;
    auVar325[0] = -((byte)((bVar309 < bVar293) * bVar309 | (bVar309 >= bVar293) * bVar293) ==
                   bVar293);
    auVar325[1] = -((byte)((bVar231 < bVar295) * bVar231 | (bVar231 >= bVar295) * bVar295) ==
                   bVar295);
    auVar325[2] = -((byte)((bVar234 < bVar296) * bVar234 | (bVar234 >= bVar296) * bVar296) ==
                   bVar296);
    auVar325[3] = -((byte)((bVar235 < bVar297) * bVar235 | (bVar235 >= bVar297) * bVar297) ==
                   bVar297);
    auVar325[4] = -((byte)((bVar236 < bVar298) * bVar236 | (bVar236 >= bVar298) * bVar298) ==
                   bVar298);
    auVar325[5] = -((byte)((bVar237 < bVar299) * bVar237 | (bVar237 >= bVar299) * bVar299) ==
                   bVar299);
    auVar325[6] = -((byte)((bVar238 < bVar300) * bVar238 | (bVar238 >= bVar300) * bVar300) ==
                   bVar300);
    auVar325[7] = -((byte)((bVar239 < bVar301) * bVar239 | (bVar239 >= bVar301) * bVar301) ==
                   bVar301);
    auVar325[8] = -((byte)((bVar240 < bVar302) * bVar240 | (bVar240 >= bVar302) * bVar302) ==
                   bVar302);
    auVar325[9] = -((byte)((bVar241 < bVar303) * bVar241 | (bVar241 >= bVar303) * bVar303) ==
                   bVar303);
    auVar325[10] = -((byte)((bVar242 < bVar304) * bVar242 | (bVar242 >= bVar304) * bVar304) ==
                    bVar304);
    auVar325[0xb] =
         -((byte)((bVar243 < bVar305) * bVar243 | (bVar243 >= bVar305) * bVar305) == bVar305);
    auVar325[0xc] =
         -((byte)((bVar244 < bVar306) * bVar244 | (bVar244 >= bVar306) * bVar306) == bVar306);
    auVar325[0xd] =
         -((byte)((bVar245 < bVar307) * bVar245 | (bVar245 >= bVar307) * bVar307) == bVar307);
    auVar325[0xe] =
         -((byte)((bVar246 < bVar308) * bVar246 | (bVar246 >= bVar308) * bVar308) == bVar308);
    auVar325[0xf] =
         -((byte)((bVar247 < bVar248) * bVar247 | (bVar247 >= bVar248) * bVar248) == bVar248);
    auVar325 = auVar325 & auVar172;
    bVar248 = *_thresh0;
    bVar293 = _thresh0[1];
    bVar295 = _thresh0[2];
    bVar296 = _thresh0[3];
    bVar297 = _thresh0[4];
    bVar298 = _thresh0[5];
    bVar299 = _thresh0[6];
    bVar300 = _thresh0[7];
    bVar301 = _thresh0[8];
    bVar302 = _thresh0[9];
    bVar303 = _thresh0[10];
    bVar304 = _thresh0[0xb];
    bVar305 = _thresh0[0xc];
    bVar306 = _thresh0[0xd];
    bVar307 = _thresh0[0xe];
    bVar308 = _thresh0[0xf];
    auVar255[0] = -((byte)((bVar167 < bVar248) * bVar167 | (bVar167 >= bVar248) * bVar248) ==
                   bVar167);
    auVar255[1] = -((byte)((bVar180 < bVar293) * bVar180 | (bVar180 >= bVar293) * bVar293) ==
                   bVar180);
    auVar255[2] = -((byte)((bVar181 < bVar295) * bVar181 | (bVar181 >= bVar295) * bVar295) ==
                   bVar181);
    auVar255[3] = -((byte)((bVar186 < bVar296) * bVar186 | (bVar186 >= bVar296) * bVar296) ==
                   bVar186);
    auVar255[4] = -((byte)((bVar187 < bVar297) * bVar187 | (bVar187 >= bVar297) * bVar297) ==
                   bVar187);
    auVar255[5] = -((byte)((bVar190 < bVar298) * bVar190 | (bVar190 >= bVar298) * bVar298) ==
                   bVar190);
    auVar255[6] = -((byte)((bVar191 < bVar299) * bVar191 | (bVar191 >= bVar299) * bVar299) ==
                   bVar191);
    auVar255[7] = -((byte)((bVar194 < bVar300) * bVar194 | (bVar194 >= bVar300) * bVar300) ==
                   bVar194);
    auVar255[8] = -((byte)((bVar195 < bVar301) * bVar195 | (bVar195 >= bVar301) * bVar301) ==
                   bVar195);
    auVar255[9] = -((byte)((bVar198 < bVar302) * bVar198 | (bVar198 >= bVar302) * bVar302) ==
                   bVar198);
    auVar255[10] = -((byte)((bVar199 < bVar303) * bVar199 | (bVar199 >= bVar303) * bVar303) ==
                    bVar199);
    auVar255[0xb] =
         -((byte)((bVar203 < bVar304) * bVar203 | (bVar203 >= bVar304) * bVar304) == bVar203);
    auVar255[0xc] =
         -((byte)((bVar204 < bVar305) * bVar204 | (bVar204 >= bVar305) * bVar305) == bVar204);
    auVar255[0xd] =
         -((byte)((bVar207 < bVar306) * bVar207 | (bVar207 >= bVar306) * bVar306) == bVar207);
    auVar255[0xe] =
         -((byte)((bVar208 < bVar307) * bVar208 | (bVar208 >= bVar307) * bVar307) == bVar208);
    auVar255[0xf] =
         -((byte)((bVar211 < bVar308) * bVar211 | (bVar211 >= bVar308) * bVar308) == bVar211);
    auVar225 = psubsb(auVar178 ^ _DAT_004d9540,auVar174 ^ _DAT_004d9540);
    auVar233 = psubsb(auVar173 ^ _DAT_004d9540,auVar179 ^ _DAT_004d9540);
    auVar225 = paddsb(~auVar255 & auVar225,auVar233);
    auVar225 = paddsb(auVar225,auVar233);
    auVar225 = paddsb(auVar225,auVar233);
    auVar254 = paddsb(_DAT_0051bb00,auVar225 & auVar172);
    auVar233[0] = -(auVar254[0] < '\0');
    auVar233[1] = -(auVar254[1] < '\0');
    auVar233[2] = -(auVar254[2] < '\0');
    auVar233[3] = -(auVar254[3] < '\0');
    auVar233[4] = -(auVar254[4] < '\0');
    auVar233[5] = -(auVar254[5] < '\0');
    auVar233[6] = -(auVar254[6] < '\0');
    auVar233[7] = -(auVar254[7] < '\0');
    auVar233[8] = -(auVar254[8] < '\0');
    auVar233[9] = -(auVar254[9] < '\0');
    auVar233[10] = -(auVar254[10] < '\0');
    auVar233[0xb] = -(auVar254[0xb] < '\0');
    auVar233[0xc] = -(auVar254[0xc] < '\0');
    auVar233[0xd] = -(auVar254[0xd] < '\0');
    auVar233[0xe] = -(auVar254[0xe] < '\0');
    auVar233[0xf] = -(auVar254[0xf] < '\0');
    auVar225 = paddsb(auVar225 & auVar172,_DAT_0051baf0);
    auVar359._0_2_ = auVar254._0_2_ >> 3;
    auVar359._2_2_ = auVar254._2_2_ >> 3;
    auVar359._4_2_ = auVar254._4_2_ >> 3;
    auVar359._6_2_ = auVar254._6_2_ >> 3;
    auVar359._8_2_ = auVar254._8_2_ >> 3;
    auVar359._10_2_ = auVar254._10_2_ >> 3;
    auVar359._12_2_ = auVar254._12_2_ >> 3;
    auVar359._14_2_ = auVar254._14_2_ >> 3;
    auVar172 = ~_DAT_004d8220 & auVar233 | auVar359 & _DAT_004d8220;
    auVar254[0] = -(auVar225[0] < '\0');
    auVar254[1] = -(auVar225[1] < '\0');
    auVar254[2] = -(auVar225[2] < '\0');
    auVar254[3] = -(auVar225[3] < '\0');
    auVar254[4] = -(auVar225[4] < '\0');
    auVar254[5] = -(auVar225[5] < '\0');
    auVar254[6] = -(auVar225[6] < '\0');
    auVar254[7] = -(auVar225[7] < '\0');
    auVar254[8] = -(auVar225[8] < '\0');
    auVar254[9] = -(auVar225[9] < '\0');
    auVar254[10] = -(auVar225[10] < '\0');
    auVar254[0xb] = -(auVar225[0xb] < '\0');
    auVar254[0xc] = -(auVar225[0xc] < '\0');
    auVar254[0xd] = -(auVar225[0xd] < '\0');
    auVar254[0xe] = -(auVar225[0xe] < '\0');
    auVar254[0xf] = -(auVar225[0xf] < '\0');
    auVar331._0_2_ = auVar225._0_2_ >> 3;
    auVar331._2_2_ = auVar225._2_2_ >> 3;
    auVar331._4_2_ = auVar225._4_2_ >> 3;
    auVar331._6_2_ = auVar225._6_2_ >> 3;
    auVar331._8_2_ = auVar225._8_2_ >> 3;
    auVar331._10_2_ = auVar225._10_2_ >> 3;
    auVar331._12_2_ = auVar225._12_2_ >> 3;
    auVar331._14_2_ = auVar225._14_2_ >> 3;
    auVar359 = psubsb(auVar173 ^ _DAT_004d9540,auVar172);
    auVar233 = paddsb(~_DAT_004d8220 & auVar254 | auVar331 & _DAT_004d8220,auVar179 ^ _DAT_004d9540)
    ;
    auVar172 = paddsb(auVar172,_DAT_004d81f0);
    auVar214._0_2_ = auVar172._0_2_ >> 1;
    auVar214._2_2_ = auVar172._2_2_ >> 1;
    auVar214._4_2_ = auVar172._4_2_ >> 1;
    auVar214._6_2_ = auVar172._6_2_ >> 1;
    auVar214._8_2_ = auVar172._8_2_ >> 1;
    auVar214._10_2_ = auVar172._10_2_ >> 1;
    auVar214._12_2_ = auVar172._12_2_ >> 1;
    auVar214._14_2_ = auVar172._14_2_ >> 1;
    auVar255 = (~_DAT_004d8200 & auVar172 | auVar214 & _DAT_004d8200) & auVar255;
    auVar172 = paddsb(auVar178 ^ _DAT_004d9540,auVar255);
    auVar225 = psubsb(auVar174 ^ _DAT_004d9540,auVar255);
    lVar165 = lVar166 * -2;
    lVar164 = -lVar166;
    auVar359 = auVar359 ^ _DAT_004d9540;
    auVar233 = auVar233 ^ _DAT_004d9540;
    auVar225 = auVar225 ^ _DAT_004d9540;
    if ((((((((((((((((auVar325 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar325 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar325 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar325 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar325 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar325 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar325 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar325 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar325 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar325 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar325 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar325 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar325 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar325 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar325 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar325[0xf])
    {
      *(undefined1 (*) [16])(s + lVar165) = auVar172 ^ _DAT_004d9540;
      *(undefined1 (*) [16])(s + lVar164) = auVar233;
      *(undefined1 (*) [16])s = auVar359;
      *(undefined1 (*) [16])(s + lVar166) = auVar225;
    }
    else {
      auVar254 = *(undefined1 (*) [16])(s + lVar166 * -6);
      auVar214 = *(undefined1 (*) [16])(s + lVar166 * -5);
      auVar255 = *(undefined1 (*) [16])(s + lVar166 * 4);
      auVar331 = *(undefined1 (*) [16])(s + lVar166 * 5);
      auVar258 = *(undefined1 (*) [16])(s + lVar166 * 6);
      auVar215 = psubusb(auVar214,auVar179);
      auVar256 = psubusb(auVar179,auVar214);
      auVar256 = auVar256 | auVar215;
      auVar215 = psubusb(auVar255,auVar173);
      auVar312 = psubusb(auVar173,auVar255);
      auVar312 = auVar312 | auVar215;
      bVar248 = auVar256[0];
      bVar293 = auVar312[0];
      bVar293 = (bVar293 < bVar248) * bVar248 | (bVar293 >= bVar248) * bVar293;
      bVar248 = auVar256[1];
      bVar295 = auVar312[1];
      bVar295 = (bVar295 < bVar248) * bVar248 | (bVar295 >= bVar248) * bVar295;
      bVar248 = auVar256[2];
      bVar296 = auVar312[2];
      bVar296 = (bVar296 < bVar248) * bVar248 | (bVar296 >= bVar248) * bVar296;
      bVar248 = auVar256[3];
      bVar297 = auVar312[3];
      bVar297 = (bVar297 < bVar248) * bVar248 | (bVar297 >= bVar248) * bVar297;
      bVar248 = auVar256[4];
      bVar298 = auVar312[4];
      bVar298 = (bVar298 < bVar248) * bVar248 | (bVar298 >= bVar248) * bVar298;
      bVar248 = auVar256[5];
      bVar299 = auVar312[5];
      bVar299 = (bVar299 < bVar248) * bVar248 | (bVar299 >= bVar248) * bVar299;
      bVar248 = auVar256[6];
      bVar300 = auVar312[6];
      bVar300 = (bVar300 < bVar248) * bVar248 | (bVar300 >= bVar248) * bVar300;
      bVar248 = auVar256[7];
      bVar301 = auVar312[7];
      bVar301 = (bVar301 < bVar248) * bVar248 | (bVar301 >= bVar248) * bVar301;
      bVar248 = auVar256[8];
      bVar302 = auVar312[8];
      bVar302 = (bVar302 < bVar248) * bVar248 | (bVar302 >= bVar248) * bVar302;
      bVar248 = auVar256[9];
      bVar303 = auVar312[9];
      bVar303 = (bVar303 < bVar248) * bVar248 | (bVar303 >= bVar248) * bVar303;
      bVar248 = auVar256[10];
      bVar304 = auVar312[10];
      bVar304 = (bVar304 < bVar248) * bVar248 | (bVar304 >= bVar248) * bVar304;
      bVar248 = auVar256[0xb];
      bVar305 = auVar312[0xb];
      bVar305 = (bVar305 < bVar248) * bVar248 | (bVar305 >= bVar248) * bVar305;
      bVar248 = auVar256[0xc];
      bVar306 = auVar312[0xc];
      bVar306 = (bVar306 < bVar248) * bVar248 | (bVar306 >= bVar248) * bVar306;
      bVar248 = auVar256[0xd];
      bVar307 = auVar312[0xd];
      bVar307 = (bVar307 < bVar248) * bVar248 | (bVar307 >= bVar248) * bVar307;
      bVar248 = auVar256[0xe];
      bVar308 = auVar312[0xe];
      bVar167 = auVar312[0xf];
      bVar308 = (bVar308 < bVar248) * bVar248 | (bVar308 >= bVar248) * bVar308;
      bVar248 = auVar256[0xf];
      bVar167 = (bVar167 < bVar248) * bVar248 | (bVar167 >= bVar248) * bVar167;
      auVar215 = psubusb(auVar254,auVar179);
      auVar256 = psubusb(auVar179,auVar254);
      auVar256 = auVar256 | auVar215;
      auVar215 = psubusb(auVar331,auVar173);
      auVar312 = psubusb(auVar173,auVar331);
      auVar312 = auVar312 | auVar215;
      auVar215 = *(undefined1 (*) [16])(s + -(long)(p * 7));
      bVar248 = auVar256[0];
      bVar180 = auVar312[0];
      bVar180 = (bVar180 < bVar248) * bVar248 | (bVar180 >= bVar248) * bVar180;
      bVar248 = auVar256[1];
      bVar181 = auVar312[1];
      bVar181 = (bVar181 < bVar248) * bVar248 | (bVar181 >= bVar248) * bVar181;
      bVar248 = auVar256[2];
      bVar186 = auVar312[2];
      bVar186 = (bVar186 < bVar248) * bVar248 | (bVar186 >= bVar248) * bVar186;
      bVar248 = auVar256[3];
      bVar187 = auVar312[3];
      bVar187 = (bVar187 < bVar248) * bVar248 | (bVar187 >= bVar248) * bVar187;
      bVar248 = auVar256[4];
      bVar190 = auVar312[4];
      bVar190 = (bVar190 < bVar248) * bVar248 | (bVar190 >= bVar248) * bVar190;
      bVar248 = auVar256[5];
      bVar191 = auVar312[5];
      bVar191 = (bVar191 < bVar248) * bVar248 | (bVar191 >= bVar248) * bVar191;
      bVar248 = auVar256[6];
      bVar194 = auVar312[6];
      bVar194 = (bVar194 < bVar248) * bVar248 | (bVar194 >= bVar248) * bVar194;
      bVar248 = auVar256[7];
      bVar195 = auVar312[7];
      bVar195 = (bVar195 < bVar248) * bVar248 | (bVar195 >= bVar248) * bVar195;
      bVar248 = auVar256[8];
      bVar198 = auVar312[8];
      bVar198 = (bVar198 < bVar248) * bVar248 | (bVar198 >= bVar248) * bVar198;
      bVar248 = auVar256[9];
      bVar199 = auVar312[9];
      bVar199 = (bVar199 < bVar248) * bVar248 | (bVar199 >= bVar248) * bVar199;
      bVar248 = auVar256[10];
      bVar203 = auVar312[10];
      bVar203 = (bVar203 < bVar248) * bVar248 | (bVar203 >= bVar248) * bVar203;
      bVar248 = auVar256[0xb];
      bVar204 = auVar312[0xb];
      bVar204 = (bVar204 < bVar248) * bVar248 | (bVar204 >= bVar248) * bVar204;
      bVar248 = auVar256[0xc];
      bVar207 = auVar312[0xc];
      bVar207 = (bVar207 < bVar248) * bVar248 | (bVar207 >= bVar248) * bVar207;
      bVar248 = auVar256[0xd];
      bVar208 = auVar312[0xd];
      bVar208 = (bVar208 < bVar248) * bVar248 | (bVar208 >= bVar248) * bVar208;
      bVar248 = auVar256[0xe];
      bVar211 = auVar312[0xe];
      bVar310 = auVar312[0xf];
      bVar211 = (bVar211 < bVar248) * bVar248 | (bVar211 >= bVar248) * bVar211;
      bVar248 = auVar256[0xf];
      bVar248 = (bVar310 < bVar248) * bVar248 | (bVar310 >= bVar248) * bVar310;
      bVar180 = (bVar180 < bVar293) * bVar293 | (bVar180 >= bVar293) * bVar180;
      bVar181 = (bVar181 < bVar295) * bVar295 | (bVar181 >= bVar295) * bVar181;
      bVar186 = (bVar186 < bVar296) * bVar296 | (bVar186 >= bVar296) * bVar186;
      bVar187 = (bVar187 < bVar297) * bVar297 | (bVar187 >= bVar297) * bVar187;
      bVar190 = (bVar190 < bVar298) * bVar298 | (bVar190 >= bVar298) * bVar190;
      bVar191 = (bVar191 < bVar299) * bVar299 | (bVar191 >= bVar299) * bVar191;
      bVar194 = (bVar194 < bVar300) * bVar300 | (bVar194 >= bVar300) * bVar194;
      bVar195 = (bVar195 < bVar301) * bVar301 | (bVar195 >= bVar301) * bVar195;
      bVar198 = (bVar198 < bVar302) * bVar302 | (bVar198 >= bVar302) * bVar198;
      bVar199 = (bVar199 < bVar303) * bVar303 | (bVar199 >= bVar303) * bVar199;
      bVar203 = (bVar203 < bVar304) * bVar304 | (bVar203 >= bVar304) * bVar203;
      bVar204 = (bVar204 < bVar305) * bVar305 | (bVar204 >= bVar305) * bVar204;
      bVar207 = (bVar207 < bVar306) * bVar306 | (bVar207 >= bVar306) * bVar207;
      bVar208 = (bVar208 < bVar307) * bVar307 | (bVar208 >= bVar307) * bVar208;
      bVar211 = (bVar211 < bVar308) * bVar308 | (bVar211 >= bVar308) * bVar211;
      bVar310 = (bVar248 < bVar167) * bVar167 | (bVar248 >= bVar167) * bVar248;
      auVar256 = psubusb(auVar215,auVar179);
      auVar312 = psubusb(auVar179,auVar215);
      auVar312 = auVar312 | auVar256;
      auVar256 = psubusb(auVar258,auVar173);
      auVar313 = psubusb(auVar173,auVar258);
      auVar313 = auVar313 | auVar256;
      bVar248 = auVar312[0];
      bVar293 = auVar313[0];
      bVar293 = (bVar293 < bVar248) * bVar248 | (bVar293 >= bVar248) * bVar293;
      bVar248 = auVar312[1];
      bVar295 = auVar313[1];
      bVar295 = (bVar295 < bVar248) * bVar248 | (bVar295 >= bVar248) * bVar295;
      bVar248 = auVar312[2];
      bVar296 = auVar313[2];
      bVar296 = (bVar296 < bVar248) * bVar248 | (bVar296 >= bVar248) * bVar296;
      bVar248 = auVar312[3];
      bVar297 = auVar313[3];
      bVar297 = (bVar297 < bVar248) * bVar248 | (bVar297 >= bVar248) * bVar297;
      bVar248 = auVar312[4];
      bVar298 = auVar313[4];
      bVar298 = (bVar298 < bVar248) * bVar248 | (bVar298 >= bVar248) * bVar298;
      bVar248 = auVar312[5];
      bVar299 = auVar313[5];
      bVar299 = (bVar299 < bVar248) * bVar248 | (bVar299 >= bVar248) * bVar299;
      bVar248 = auVar312[6];
      bVar300 = auVar313[6];
      bVar300 = (bVar300 < bVar248) * bVar248 | (bVar300 >= bVar248) * bVar300;
      bVar248 = auVar312[7];
      bVar301 = auVar313[7];
      bVar301 = (bVar301 < bVar248) * bVar248 | (bVar301 >= bVar248) * bVar301;
      bVar248 = auVar312[8];
      bVar302 = auVar313[8];
      bVar302 = (bVar302 < bVar248) * bVar248 | (bVar302 >= bVar248) * bVar302;
      bVar248 = auVar312[9];
      bVar303 = auVar313[9];
      bVar303 = (bVar303 < bVar248) * bVar248 | (bVar303 >= bVar248) * bVar303;
      bVar248 = auVar312[10];
      bVar304 = auVar313[10];
      bVar304 = (bVar304 < bVar248) * bVar248 | (bVar304 >= bVar248) * bVar304;
      bVar248 = auVar312[0xb];
      bVar305 = auVar313[0xb];
      bVar305 = (bVar305 < bVar248) * bVar248 | (bVar305 >= bVar248) * bVar305;
      bVar248 = auVar312[0xc];
      bVar306 = auVar313[0xc];
      bVar306 = (bVar306 < bVar248) * bVar248 | (bVar306 >= bVar248) * bVar306;
      bVar248 = auVar312[0xd];
      bVar307 = auVar313[0xd];
      bVar307 = (bVar307 < bVar248) * bVar248 | (bVar307 >= bVar248) * bVar307;
      bVar248 = auVar312[0xe];
      bVar308 = auVar313[0xe];
      bVar167 = auVar313[0xf];
      bVar308 = (bVar308 < bVar248) * bVar248 | (bVar308 >= bVar248) * bVar308;
      bVar248 = auVar312[0xf];
      bVar167 = (bVar167 < bVar248) * bVar248 | (bVar167 >= bVar248) * bVar167;
      bVar248 = (bVar293 < bVar180) * bVar180 | (bVar293 >= bVar180) * bVar293;
      bVar293 = (bVar295 < bVar181) * bVar181 | (bVar295 >= bVar181) * bVar295;
      bVar295 = (bVar296 < bVar186) * bVar186 | (bVar296 >= bVar186) * bVar296;
      bVar296 = (bVar297 < bVar187) * bVar187 | (bVar297 >= bVar187) * bVar297;
      bVar297 = (bVar298 < bVar190) * bVar190 | (bVar298 >= bVar190) * bVar298;
      bVar298 = (bVar299 < bVar191) * bVar191 | (bVar299 >= bVar191) * bVar299;
      bVar299 = (bVar300 < bVar194) * bVar194 | (bVar300 >= bVar194) * bVar300;
      bVar300 = (bVar301 < bVar195) * bVar195 | (bVar301 >= bVar195) * bVar301;
      bVar301 = (bVar302 < bVar198) * bVar198 | (bVar302 >= bVar198) * bVar302;
      bVar302 = (bVar303 < bVar199) * bVar199 | (bVar303 >= bVar199) * bVar303;
      bVar303 = (bVar304 < bVar203) * bVar203 | (bVar304 >= bVar203) * bVar304;
      bVar304 = (bVar305 < bVar204) * bVar204 | (bVar305 >= bVar204) * bVar305;
      bVar305 = (bVar306 < bVar207) * bVar207 | (bVar306 >= bVar207) * bVar306;
      bVar306 = (bVar307 < bVar208) * bVar208 | (bVar307 >= bVar208) * bVar307;
      bVar307 = (bVar308 < bVar211) * bVar211 | (bVar308 >= bVar211) * bVar308;
      bVar308 = (bVar167 < bVar310) * bVar310 | (bVar167 >= bVar310) * bVar167;
      local_1d8[1] = -((byte)((bVar293 < bVar231) * bVar293 | (bVar293 >= bVar231) * bVar231) ==
                      bVar293);
      local_1d8[0] = -((byte)((bVar248 < bVar309) * bVar248 | (bVar248 >= bVar309) * bVar309) ==
                      bVar248);
      local_1d8[2] = -((byte)((bVar295 < bVar234) * bVar295 | (bVar295 >= bVar234) * bVar234) ==
                      bVar295);
      local_1d8[3] = -((byte)((bVar296 < bVar235) * bVar296 | (bVar296 >= bVar235) * bVar235) ==
                      bVar296);
      local_1d8[4] = -((byte)((bVar297 < bVar236) * bVar297 | (bVar297 >= bVar236) * bVar236) ==
                      bVar297);
      local_1d8[5] = -((byte)((bVar298 < bVar237) * bVar298 | (bVar298 >= bVar237) * bVar237) ==
                      bVar298);
      local_1d8[6] = -((byte)((bVar299 < bVar238) * bVar299 | (bVar299 >= bVar238) * bVar238) ==
                      bVar299);
      local_1d8[7] = -((byte)((bVar300 < bVar239) * bVar300 | (bVar300 >= bVar239) * bVar239) ==
                      bVar300);
      local_1d8[8] = -((byte)((bVar301 < bVar240) * bVar301 | (bVar301 >= bVar240) * bVar240) ==
                      bVar301);
      local_1d8[9] = -((byte)((bVar302 < bVar241) * bVar302 | (bVar302 >= bVar241) * bVar241) ==
                      bVar302);
      local_1d8[10] =
           -((byte)((bVar303 < bVar242) * bVar303 | (bVar303 >= bVar242) * bVar242) == bVar303);
      local_1d8[0xb] =
           -((byte)((bVar304 < bVar243) * bVar304 | (bVar304 >= bVar243) * bVar243) == bVar304);
      local_1d8[0xc] =
           -((byte)((bVar305 < bVar244) * bVar305 | (bVar305 >= bVar244) * bVar244) == bVar305);
      local_1d8[0xd] =
           -((byte)((bVar306 < bVar245) * bVar306 | (bVar306 >= bVar245) * bVar245) == bVar306);
      local_1d8[0xe] =
           -((byte)((bVar307 < bVar246) * bVar307 | (bVar307 >= bVar246) * bVar246) == bVar307);
      local_1d8[0xf] =
           -((byte)((bVar308 < bVar247) * bVar308 | (bVar308 >= bVar247) * bVar247) == bVar308);
      auVar2[0xd] = 0;
      auVar2._0_13_ = auVar176._0_13_;
      auVar2[0xe] = auVar176[7];
      uVar171 = auVar2._13_2_;
      auVar16[0xc] = auVar176[6];
      auVar16._0_12_ = auVar176._0_12_;
      auVar16._13_2_ = uVar171;
      auVar30[0xb] = 0;
      auVar30._0_11_ = auVar176._0_11_;
      auVar30._12_3_ = auVar16._12_3_;
      auVar44[10] = auVar176[5];
      auVar44._0_10_ = auVar176._0_10_;
      auVar44._11_4_ = auVar30._11_4_;
      auVar58[9] = 0;
      auVar58._0_9_ = auVar176._0_9_;
      auVar58._10_5_ = auVar44._10_5_;
      auVar72[8] = auVar176[4];
      auVar72._0_8_ = auVar176._0_8_;
      auVar72._9_6_ = auVar58._9_6_;
      auVar100._7_8_ = 0;
      auVar100._0_7_ = auVar72._8_7_;
      Var101 = CONCAT81(SUB158(auVar100 << 0x40,7),auVar176[3]);
      auVar136._9_6_ = 0;
      auVar136._0_9_ = Var101;
      auVar102._1_10_ = SUB1510(auVar136 << 0x30,5);
      auVar102[0] = auVar176[2];
      auVar137._11_4_ = 0;
      auVar137._0_11_ = auVar102;
      auVar86[2] = auVar176[1];
      auVar86._0_2_ = auVar176._0_2_;
      auVar86._3_12_ = SUB1512(auVar137 << 0x20,3);
      uVar230 = auVar176._0_2_ & 0xff;
      auVar3[0xd] = 0;
      auVar3._0_13_ = auVar177._0_13_;
      auVar3[0xe] = auVar177[7];
      uVar185 = auVar3._13_2_;
      auVar17[0xc] = auVar177[6];
      auVar17._0_12_ = auVar177._0_12_;
      auVar17._13_2_ = uVar185;
      auVar31[0xb] = 0;
      auVar31._0_11_ = auVar177._0_11_;
      auVar31._12_3_ = auVar17._12_3_;
      auVar45[10] = auVar177[5];
      auVar45._0_10_ = auVar177._0_10_;
      auVar45._11_4_ = auVar31._11_4_;
      auVar59[9] = 0;
      auVar59._0_9_ = auVar177._0_9_;
      auVar59._10_5_ = auVar45._10_5_;
      auVar73[8] = auVar177[4];
      auVar73._0_8_ = auVar177._0_8_;
      auVar73._9_6_ = auVar59._9_6_;
      auVar103._7_8_ = 0;
      auVar103._0_7_ = auVar73._8_7_;
      Var104 = CONCAT81(SUB158(auVar103 << 0x40,7),auVar177[3]);
      auVar138._9_6_ = 0;
      auVar138._0_9_ = Var104;
      auVar105._1_10_ = SUB1510(auVar138 << 0x30,5);
      auVar105[0] = auVar177[2];
      auVar139._11_4_ = 0;
      auVar139._0_11_ = auVar105;
      auVar87[2] = auVar177[1];
      auVar87._0_2_ = auVar177._0_2_;
      auVar87._3_12_ = SUB1512(auVar139 << 0x20,3);
      uVar329 = auVar177._0_2_ & 0xff;
      auVar4[0xd] = 0;
      auVar4._0_13_ = auVar178._0_13_;
      auVar4[0xe] = auVar178[7];
      uVar317 = auVar4._13_2_;
      auVar18[0xc] = auVar178[6];
      auVar18._0_12_ = auVar178._0_12_;
      auVar18._13_2_ = uVar317;
      auVar32[0xb] = 0;
      auVar32._0_11_ = auVar178._0_11_;
      auVar32._12_3_ = auVar18._12_3_;
      auVar46[10] = auVar178[5];
      auVar46._0_10_ = auVar178._0_10_;
      auVar46._11_4_ = auVar32._11_4_;
      auVar60[9] = 0;
      auVar60._0_9_ = auVar178._0_9_;
      auVar60._10_5_ = auVar46._10_5_;
      auVar74[8] = auVar178[4];
      auVar74._0_8_ = auVar178._0_8_;
      auVar74._9_6_ = auVar60._9_6_;
      auVar106._7_8_ = 0;
      auVar106._0_7_ = auVar74._8_7_;
      Var107 = CONCAT81(SUB158(auVar106 << 0x40,7),auVar178[3]);
      auVar140._9_6_ = 0;
      auVar140._0_9_ = Var107;
      auVar108._1_10_ = SUB1510(auVar140 << 0x30,5);
      auVar108[0] = auVar178[2];
      auVar141._11_4_ = 0;
      auVar141._0_11_ = auVar108;
      auVar88[2] = auVar178[1];
      auVar88._0_2_ = auVar178._0_2_;
      auVar88._3_12_ = SUB1512(auVar141 << 0x20,3);
      uVar212 = auVar178._0_2_ & 0xff;
      auVar5[0xd] = 0;
      auVar5._0_13_ = auVar179._0_13_;
      auVar5[0xe] = auVar179[7];
      uVar170 = auVar5._13_2_;
      auVar19[0xc] = auVar179[6];
      auVar19._0_12_ = auVar179._0_12_;
      auVar19._13_2_ = uVar170;
      auVar33[0xb] = 0;
      auVar33._0_11_ = auVar179._0_11_;
      auVar33._12_3_ = auVar19._12_3_;
      auVar47[10] = auVar179[5];
      auVar47._0_10_ = auVar179._0_10_;
      auVar47._11_4_ = auVar33._11_4_;
      auVar61[9] = 0;
      auVar61._0_9_ = auVar179._0_9_;
      auVar61._10_5_ = auVar47._10_5_;
      auVar75[8] = auVar179[4];
      auVar75._0_8_ = auVar179._0_8_;
      auVar75._9_6_ = auVar61._9_6_;
      auVar109._7_8_ = 0;
      auVar109._0_7_ = auVar75._8_7_;
      Var110 = CONCAT81(SUB158(auVar109 << 0x40,7),auVar179[3]);
      auVar142._9_6_ = 0;
      auVar142._0_9_ = Var110;
      auVar111._1_10_ = SUB1510(auVar142 << 0x30,5);
      auVar111[0] = auVar179[2];
      auVar143._11_4_ = 0;
      auVar143._0_11_ = auVar111;
      auVar89[2] = auVar179[1];
      auVar89._0_2_ = auVar179._0_2_;
      auVar89._3_12_ = SUB1512(auVar143 << 0x20,3);
      uVar281 = auVar179._0_2_ & 0xff;
      auVar6[0xd] = 0;
      auVar6._0_13_ = auVar173._0_13_;
      auVar6[0xe] = auVar173[7];
      uVar184 = auVar6._13_2_;
      auVar20[0xc] = auVar173[6];
      auVar20._0_12_ = auVar173._0_12_;
      auVar20._13_2_ = uVar184;
      auVar34[0xb] = 0;
      auVar34._0_11_ = auVar173._0_11_;
      auVar34._12_3_ = auVar20._12_3_;
      auVar48[10] = auVar173[5];
      auVar48._0_10_ = auVar173._0_10_;
      auVar48._11_4_ = auVar34._11_4_;
      auVar62[9] = 0;
      auVar62._0_9_ = auVar173._0_9_;
      auVar62._10_5_ = auVar48._10_5_;
      auVar76[8] = auVar173[4];
      auVar76._0_8_ = auVar173._0_8_;
      auVar76._9_6_ = auVar62._9_6_;
      auVar112._7_8_ = 0;
      auVar112._0_7_ = auVar76._8_7_;
      Var113 = CONCAT81(SUB158(auVar112 << 0x40,7),auVar173[3]);
      auVar144._9_6_ = 0;
      auVar144._0_9_ = Var113;
      auVar114._1_10_ = SUB1510(auVar144 << 0x30,5);
      auVar114[0] = auVar173[2];
      auVar145._11_4_ = 0;
      auVar145._0_11_ = auVar114;
      auVar90[2] = auVar173[1];
      auVar90._0_2_ = auVar173._0_2_;
      auVar90._3_12_ = SUB1512(auVar145 << 0x20,3);
      uVar217 = auVar173._0_2_ & 0xff;
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar174._0_13_;
      auVar7[0xe] = auVar174[7];
      auVar21[0xc] = auVar174[6];
      auVar21._0_12_ = auVar174._0_12_;
      auVar21._13_2_ = auVar7._13_2_;
      auVar35[0xb] = 0;
      auVar35._0_11_ = auVar174._0_11_;
      auVar35._12_3_ = auVar21._12_3_;
      auVar49[10] = auVar174[5];
      auVar49._0_10_ = auVar174._0_10_;
      auVar49._11_4_ = auVar35._11_4_;
      auVar63[9] = 0;
      auVar63._0_9_ = auVar174._0_9_;
      auVar63._10_5_ = auVar49._10_5_;
      auVar77[8] = auVar174[4];
      auVar77._0_8_ = auVar174._0_8_;
      auVar77._9_6_ = auVar63._9_6_;
      auVar115._7_8_ = 0;
      auVar115._0_7_ = auVar77._8_7_;
      Var116 = CONCAT81(SUB158(auVar115 << 0x40,7),auVar174[3]);
      auVar146._9_6_ = 0;
      auVar146._0_9_ = Var116;
      auVar117._1_10_ = SUB1510(auVar146 << 0x30,5);
      auVar117[0] = auVar174[2];
      auVar147._11_4_ = 0;
      auVar147._0_11_ = auVar117;
      auVar91[2] = auVar174[1];
      auVar91._0_2_ = auVar174._0_2_;
      auVar91._3_12_ = SUB1512(auVar147 << 0x20,3);
      uVar221 = auVar174._0_2_ & 0xff;
      auVar8[0xd] = 0;
      auVar8._0_13_ = auVar175._0_13_;
      auVar8[0xe] = auVar175[7];
      auVar22[0xc] = auVar175[6];
      auVar22._0_12_ = auVar175._0_12_;
      auVar22._13_2_ = auVar8._13_2_;
      auVar36[0xb] = 0;
      auVar36._0_11_ = auVar175._0_11_;
      auVar36._12_3_ = auVar22._12_3_;
      auVar50[10] = auVar175[5];
      auVar50._0_10_ = auVar175._0_10_;
      auVar50._11_4_ = auVar36._11_4_;
      auVar64[9] = 0;
      auVar64._0_9_ = auVar175._0_9_;
      auVar64._10_5_ = auVar50._10_5_;
      auVar78[8] = auVar175[4];
      auVar78._0_8_ = auVar175._0_8_;
      auVar78._9_6_ = auVar64._9_6_;
      auVar118._7_8_ = 0;
      auVar118._0_7_ = auVar78._8_7_;
      Var119 = CONCAT81(SUB158(auVar118 << 0x40,7),auVar175[3]);
      auVar148._9_6_ = 0;
      auVar148._0_9_ = Var119;
      auVar120._1_10_ = SUB1510(auVar148 << 0x30,5);
      auVar120[0] = auVar175[2];
      auVar149._11_4_ = 0;
      auVar149._0_11_ = auVar120;
      auVar92[2] = auVar175[1];
      auVar92._0_2_ = auVar175._0_2_;
      auVar92._3_12_ = SUB1512(auVar149 << 0x20,3);
      uVar226 = auVar175._0_2_ & 0xff;
      auVar9[0xd] = 0;
      auVar9._0_13_ = auVar326._0_13_;
      auVar9[0xe] = auVar326[7];
      auVar23[0xc] = auVar326[6];
      auVar23._0_12_ = auVar326._0_12_;
      auVar23._13_2_ = auVar9._13_2_;
      auVar37[0xb] = 0;
      auVar37._0_11_ = auVar326._0_11_;
      auVar37._12_3_ = auVar23._12_3_;
      auVar51[10] = auVar326[5];
      auVar51._0_10_ = auVar326._0_10_;
      auVar51._11_4_ = auVar37._11_4_;
      auVar65[9] = 0;
      auVar65._0_9_ = auVar326._0_9_;
      auVar65._10_5_ = auVar51._10_5_;
      auVar79[8] = auVar326[4];
      auVar79._0_8_ = auVar326._0_8_;
      auVar79._9_6_ = auVar65._9_6_;
      auVar121._7_8_ = 0;
      auVar121._0_7_ = auVar79._8_7_;
      Var122 = CONCAT81(SUB158(auVar121 << 0x40,7),auVar326[3]);
      auVar150._9_6_ = 0;
      auVar150._0_9_ = Var122;
      auVar123._1_10_ = SUB1510(auVar150 << 0x30,5);
      auVar123[0] = auVar326[2];
      auVar151._11_4_ = 0;
      auVar151._0_11_ = auVar123;
      auVar93[2] = auVar326[1];
      auVar93._0_2_ = auVar326._0_2_;
      auVar93._3_12_ = SUB1512(auVar151 << 0x20,3);
      uVar232 = auVar326._0_2_ & 0xff;
      uVar227 = (ushort)auVar176[8];
      bVar309 = auVar176[10];
      bVar231 = auVar176[0xb];
      bVar234 = auVar176[0xc];
      bVar235 = auVar176[0xd];
      bVar236 = auVar176[0xe];
      bVar237 = auVar176[0xf];
      uVar324 = (ushort)auVar177[8];
      bVar244 = auVar177[10];
      bVar245 = auVar177[0xb];
      bVar246 = auVar177[0xc];
      bVar247 = auVar177[0xd];
      bVar248 = auVar177[0xe];
      bVar293 = auVar177[0xf];
      uVar362 = (ushort)auVar178[8];
      bVar295 = auVar178[9];
      bVar296 = auVar178[0xf];
      uVar294 = (ushort)auVar179[8];
      bVar238 = auVar179[10];
      bVar239 = auVar179[0xb];
      bVar240 = auVar179[0xc];
      bVar241 = auVar179[0xd];
      bVar242 = auVar179[0xe];
      bVar243 = auVar179[0xf];
      uStack_2a0._0_1_ = auVar173[8];
      uStack_2a0._1_1_ = auVar173[9];
      uStack_29e._0_1_ = auVar173[10];
      uStack_29e._1_1_ = auVar173[0xb];
      uStack_29c._0_1_ = auVar173[0xc];
      uStack_29c._1_1_ = auVar173[0xd];
      uStack_29a._0_1_ = auVar173[0xe];
      uVar228 = (ushort)(byte)uStack_2a0;
      uVar366 = (ushort)auVar174[8];
      uVar311 = (ushort)auVar175[8];
      uVar213 = (ushort)auVar326[8];
      sVar275 = auVar86._2_2_;
      sVar370 = auVar87._2_2_;
      sVar276 = auVar102._0_2_;
      sVar372 = auVar105._0_2_;
      sVar277 = (short)Var101;
      sVar374 = (short)Var104;
      sVar278 = auVar72._8_2_;
      sVar376 = auVar73._8_2_;
      sVar279 = auVar44._10_2_;
      sVar378 = auVar45._10_2_;
      sVar280 = auVar16._12_2_;
      sVar380 = auVar17._12_2_;
      uVar229 = uVar171 >> 8;
      sVar382 = (uVar185 >> 8) + uVar229;
      sVar216 = auVar88._2_2_;
      sVar218 = auVar108._0_2_;
      sVar219 = (short)Var107;
      sVar220 = auVar74._8_2_;
      sVar222 = auVar46._10_2_;
      sVar223 = auVar18._12_2_;
      uVar322 = uVar317 >> 8;
      sVar224 = uVar322 + (uVar185 >> 8);
      sVar182 = auVar90._2_2_;
      sVar282 = auVar89._2_2_;
      sVar188 = auVar114._0_2_;
      sVar283 = auVar111._0_2_;
      sVar192 = (short)Var113;
      sVar285 = (short)Var110;
      sVar196 = auVar76._8_2_;
      sVar287 = auVar75._8_2_;
      sVar200 = auVar48._10_2_;
      sVar289 = auVar47._10_2_;
      sVar205 = auVar20._12_2_;
      uVar202 = uVar184 >> 8;
      sVar291 = auVar19._12_2_;
      uVar169 = uVar170 >> 8;
      uVar250 = (ushort)auVar176[9];
      uVar270 = (ushort)auVar177[9];
      uVar260 = (ushort)bVar309;
      uVar262 = (ushort)bVar231;
      uVar264 = (ushort)bVar234;
      uVar266 = (ushort)bVar235;
      uVar269 = (ushort)bVar236;
      uVar272 = (ushort)bVar237;
      uVar323 = (ushort)bVar295;
      uVar251 = (ushort)auVar178[10];
      sVar334 = uVar251 + bVar244;
      uVar252 = (ushort)auVar178[0xb];
      sVar337 = uVar252 + bVar245;
      uVar253 = (ushort)auVar178[0xc];
      sVar340 = uVar253 + bVar246;
      uVar274 = (ushort)auVar178[0xd];
      sVar343 = uVar274 + bVar247;
      uVar327 = (ushort)auVar178[0xe];
      uVar358 = (ushort)bVar296;
      sVar346 = uVar327 + bVar248;
      sVar349 = uVar358 + bVar293;
      uStack_2a6 = (ushort)uStack_2a0._1_1_;
      uStack_2a4 = (ushort)(byte)uStack_29e;
      uStack_2a2 = (ushort)uStack_29e._1_1_;
      uStack_2a0 = (ushort)(byte)uStack_29c;
      uStack_29e = (ushort)uStack_29c._1_1_;
      uStack_29c = (ushort)(byte)uStack_29a;
      uStack_29a = (ushort)auVar173[0xf];
      uVar267 = (ushort)auVar179[9];
      uVar249 = uVar230 * 2 + uVar329 + uVar230 + uVar217 + uVar281 + uVar212 + uVar329 + 4;
      uVar259 = sVar275 * 2 + sVar370 + sVar275 + sVar182 + sVar282 + sVar216 + sVar370 + 4;
      uVar261 = sVar276 * 2 + sVar372 + sVar276 + sVar188 + sVar283 + sVar218 + sVar372 + 4;
      uVar263 = sVar277 * 2 + sVar374 + sVar277 + sVar192 + sVar285 + sVar219 + sVar374 + 4;
      uVar265 = sVar278 * 2 + sVar376 + sVar278 + sVar196 + sVar287 + sVar220 + sVar376 + 4;
      uVar268 = sVar279 * 2 + sVar378 + sVar279 + sVar200 + sVar289 + sVar222 + sVar378 + 4;
      uVar271 = sVar280 * 2 + sVar380 + sVar280 + sVar205 + sVar291 + sVar223 + sVar380 + 4;
      uVar273 = uVar229 * 2 + sVar382 + uVar202 + uVar169 + sVar224 + 4;
      uVar168 = uVar227 * 2 + uVar324 + uVar227 + uVar228 + uVar294 + uVar362 + uVar324 + 4;
      uVar183 = uVar250 * 2 + uVar270 + uVar250 + uStack_2a6 + uVar267 + uVar323 + uVar270 + 4;
      uVar189 = bVar309 + uVar260 + bVar244 + uVar260 + uStack_2a4 + bVar238 + sVar334 + 4;
      uVar193 = bVar231 + uVar262 + bVar245 + uVar262 + uStack_2a2 + bVar239 + sVar337 + 4;
      uVar197 = bVar234 + uVar264 + bVar246 + uVar264 + uStack_2a0 + bVar240 + sVar340 + 4;
      uVar201 = bVar235 + uVar266 + bVar247 + uVar266 + uStack_29e + bVar241 + sVar343 + 4;
      uVar206 = bVar236 + uVar269 + bVar248 + uVar269 + uStack_29c + bVar242 + sVar346 + 4;
      uVar209 = bVar237 + uVar272 + bVar293 + uVar272 + uStack_29a + bVar243 + sVar349 + 4;
      sStack_2b6 = auVar91._2_2_;
      sStack_2b4 = auVar117._0_2_;
      sStack_2b2 = (short)Var116;
      sStack_2b0 = auVar77._8_2_;
      sStack_2ae = auVar49._10_2_;
      sStack_2ac = auVar21._12_2_;
      uVar210 = auVar7._13_2_ >> 8;
      uVar330 = (uVar212 - (uVar329 + uVar230)) + uVar221 + uVar249;
      uVar332 = (sVar216 - (sVar370 + sVar275)) + sStack_2b6 + uVar259;
      uVar335 = (sVar218 - (sVar372 + sVar276)) + sStack_2b4 + uVar261;
      uVar338 = (sVar219 - (sVar374 + sVar277)) + sStack_2b2 + uVar263;
      uVar341 = (sVar220 - (sVar376 + sVar278)) + sStack_2b0 + uVar265;
      uVar344 = (sVar222 - (sVar378 + sVar279)) + sStack_2ae + uVar268;
      uVar347 = (sVar223 - (sVar380 + sVar280)) + sStack_2ac + uVar271;
      uVar350 = (uVar322 - sVar382) + uVar210 + uVar273;
      uVar249 = uVar249 >> 3;
      uVar259 = uVar259 >> 3;
      uVar261 = uVar261 >> 3;
      uVar263 = uVar263 >> 3;
      uVar265 = uVar265 >> 3;
      uVar268 = uVar268 >> 3;
      uVar271 = uVar271 >> 3;
      uVar273 = uVar273 >> 3;
      uStack_2c6 = (ushort)auVar174[9];
      uStack_2c4 = (ushort)auVar174[10];
      uStack_2c2 = (ushort)auVar174[0xb];
      uStack_2c0 = (ushort)auVar174[0xc];
      uStack_2be = (ushort)auVar174[0xd];
      uStack_2bc = (ushort)auVar174[0xe];
      uStack_2ba = (ushort)auVar174[0xf];
      uVar367 = (uVar362 - (uVar324 + uVar227)) + uVar366 + uVar168;
      uVar371 = (uVar323 - (uVar270 + uVar250)) + uStack_2c6 + uVar183;
      uVar373 = (uVar251 - (bVar244 + uVar260)) + uStack_2c4 + uVar189;
      uVar375 = (uVar252 - (bVar245 + uVar262)) + uStack_2c2 + uVar193;
      uVar377 = (uVar253 - (bVar246 + uVar264)) + uStack_2c0 + uVar197;
      uVar379 = (uVar274 - (bVar247 + uVar266)) + uStack_2be + uVar201;
      uVar381 = (uVar327 - (bVar248 + uVar269)) + uStack_2bc + uVar206;
      uVar383 = (uVar358 - (bVar293 + uVar272)) + uStack_2ba + uVar209;
      uVar168 = uVar168 >> 3;
      uVar183 = uVar183 >> 3;
      uVar189 = uVar189 >> 3;
      uVar193 = uVar193 >> 3;
      uVar197 = uVar197 >> 3;
      uVar201 = uVar201 >> 3;
      uVar206 = uVar206 >> 3;
      uVar209 = uVar209 >> 3;
      auVar173[1] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
      auVar173[0] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
      auVar173[2] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
      auVar173[3] = (uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263);
      auVar173[4] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
      auVar173[5] = (uVar268 != 0) * (uVar268 < 0x100) * (char)uVar268 - (0xff < uVar268);
      auVar173[6] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
      auVar173[7] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
      auVar173[8] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
      auVar173[9] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
      auVar173[10] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
      auVar173[0xb] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar173[0xc] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
      auVar173[0xd] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar173[0xe] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
      auVar173[0xf] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
      auVar173 = ~auVar325 & auVar177 | auVar173 & auVar325;
      sStack_266 = auVar92._2_2_;
      sStack_264 = auVar120._0_2_;
      sStack_262 = (short)Var119;
      sStack_260 = auVar78._8_2_;
      sStack_25e = auVar50._10_2_;
      sStack_25c = auVar22._12_2_;
      uVar168 = auVar8._13_2_ >> 8;
      uVar249 = (uVar281 - (uVar212 + uVar230)) + uVar226 + uVar330;
      uVar259 = (sVar282 - (sVar216 + sVar275)) + sStack_266 + uVar332;
      uVar261 = (sVar283 - (sVar218 + sVar276)) + sStack_264 + uVar335;
      uVar263 = (sVar285 - (sVar219 + sVar277)) + sStack_262 + uVar338;
      uVar265 = (sVar287 - (sVar220 + sVar278)) + sStack_260 + uVar341;
      uVar268 = (sVar289 - (sVar222 + sVar279)) + sStack_25e + uVar344;
      uVar271 = (sVar291 - (sVar223 + sVar280)) + sStack_25c + uVar347;
      uVar273 = (uVar169 - (uVar322 + uVar229)) + uVar168 + uVar350;
      uVar330 = uVar330 >> 3;
      uVar332 = uVar332 >> 3;
      uVar335 = uVar335 >> 3;
      uVar338 = uVar338 >> 3;
      uVar341 = uVar341 >> 3;
      uVar344 = uVar344 >> 3;
      uVar347 = uVar347 >> 3;
      uVar350 = uVar350 >> 3;
      uStack_1c6 = (ushort)auVar175[9];
      uStack_1c4 = (ushort)auVar175[10];
      uStack_1c2 = (ushort)auVar175[0xb];
      uStack_1c0 = (ushort)auVar175[0xc];
      uStack_1be = (ushort)auVar175[0xd];
      uStack_1bc = (ushort)auVar175[0xe];
      uStack_1ba = (ushort)auVar175[0xf];
      uVar351 = (uVar294 - (uVar362 + uVar227)) + uVar311 + uVar367;
      uVar352 = (uVar267 - (bVar295 + uVar250)) + uStack_1c6 + uVar371;
      uVar353 = ((ushort)bVar238 - (uVar251 + uVar260)) + uStack_1c4 + uVar373;
      uVar354 = ((ushort)bVar239 - (uVar252 + uVar262)) + uStack_1c2 + uVar375;
      uVar355 = ((ushort)bVar240 - (uVar253 + uVar264)) + uStack_1c0 + uVar377;
      uVar356 = ((ushort)bVar241 - (uVar274 + uVar266)) + uStack_1be + uVar379;
      uVar357 = ((ushort)bVar242 - (uVar327 + uVar269)) + uStack_1bc + uVar381;
      uVar358 = ((ushort)bVar243 - (uVar358 + uVar272)) + uStack_1ba + uVar383;
      uVar367 = uVar367 >> 3;
      uVar371 = uVar371 >> 3;
      uVar373 = uVar373 >> 3;
      uVar375 = uVar375 >> 3;
      uVar377 = uVar377 >> 3;
      uVar379 = uVar379 >> 3;
      uVar381 = uVar381 >> 3;
      uVar383 = uVar383 >> 3;
      auVar174[1] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
      auVar174[0] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
      auVar174[2] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
      auVar174[3] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
      auVar174[4] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar174[5] = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
      auVar174[6] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
      auVar174[7] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
      auVar174[8] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
      auVar174[9] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
      auVar174[10] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
      auVar174[0xb] = (uVar375 != 0) * (uVar375 < 0x100) * (char)uVar375 - (0xff < uVar375);
      auVar174[0xc] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
      auVar174[0xd] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
      auVar174[0xe] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
      auVar174[0xf] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
      auVar174 = ~auVar325 & (auVar172 ^ _DAT_004d9540) | auVar174 & auVar325;
      sStack_e6 = auVar93._2_2_;
      sStack_e4 = auVar123._0_2_;
      sStack_e2 = (short)Var122;
      sStack_e0 = auVar79._8_2_;
      sStack_de = auVar51._10_2_;
      sStack_dc = auVar23._12_2_;
      uVar322 = auVar9._13_2_ >> 8;
      uVar183 = (uVar217 - (uVar281 + uVar230)) + uVar232 + uVar249;
      uVar189 = (sVar182 - (sVar282 + sVar275)) + sStack_e6 + uVar259;
      uVar193 = (sVar188 - (sVar283 + sVar276)) + sStack_e4 + uVar261;
      uVar197 = (sVar192 - (sVar285 + sVar277)) + sStack_e2 + uVar263;
      uVar201 = (sVar196 - (sVar287 + sVar278)) + sStack_e0 + uVar265;
      uVar206 = (sVar200 - (sVar289 + sVar279)) + sStack_de + uVar268;
      uVar209 = (sVar205 - (sVar291 + sVar280)) + sStack_dc + uVar271;
      uVar229 = (uVar202 - (uVar169 + uVar229)) + uVar322 + uVar273;
      uVar249 = uVar249 >> 3;
      uVar259 = uVar259 >> 3;
      uVar261 = uVar261 >> 3;
      uVar263 = uVar263 >> 3;
      uVar265 = uVar265 >> 3;
      uVar268 = uVar268 >> 3;
      uVar271 = uVar271 >> 3;
      uVar273 = uVar273 >> 3;
      uStack_f6 = (ushort)auVar326[9];
      uStack_f4 = (ushort)auVar326[10];
      uStack_f2 = (ushort)auVar326[0xb];
      uStack_f0 = (ushort)auVar326[0xc];
      uStack_ee = (ushort)auVar326[0xd];
      uStack_ec = (ushort)auVar326[0xe];
      uStack_ea = (ushort)auVar326[0xf];
      uVar330 = (uVar228 - (uVar294 + uVar227)) + uVar213 + uVar351;
      uVar335 = (uStack_2a6 - (uVar267 + uVar250)) + uStack_f6 + uVar352;
      uVar341 = (uStack_2a4 - (bVar238 + uVar260)) + uStack_f4 + uVar353;
      uVar347 = (uStack_2a2 - (bVar239 + uVar262)) + uStack_f2 + uVar354;
      uVar350 = (uStack_2a0 - (bVar240 + uVar264)) + uStack_f0 + uVar355;
      uVar367 = (uStack_29e - (bVar241 + uVar266)) + uStack_ee + uVar356;
      uVar371 = (uStack_29c - (bVar242 + uVar269)) + uStack_ec + uVar357;
      uVar373 = (uStack_29a - (bVar243 + uVar272)) + uStack_ea + uVar358;
      uVar351 = uVar351 >> 3;
      uVar352 = uVar352 >> 3;
      uVar353 = uVar353 >> 3;
      uVar354 = uVar354 >> 3;
      uVar355 = uVar355 >> 3;
      uVar356 = uVar356 >> 3;
      uVar357 = uVar357 >> 3;
      uVar358 = uVar358 >> 3;
      auVar313[1] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
      auVar313[0] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
      auVar313[2] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
      auVar313[3] = (uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263);
      auVar313[4] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
      auVar313[5] = (uVar268 != 0) * (uVar268 < 0x100) * (char)uVar268 - (0xff < uVar268);
      auVar313[6] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
      auVar313[7] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
      auVar313[8] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
      auVar313[9] = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
      auVar313[10] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
      auVar313[0xb] = (uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 - (0xff < uVar354);
      auVar313[0xc] = (uVar355 != 0) * (uVar355 < 0x100) * (char)uVar355 - (0xff < uVar355);
      auVar313[0xd] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
      auVar313[0xe] = (uVar357 != 0) * (uVar357 < 0x100) * (char)uVar357 - (0xff < uVar357);
      auVar313[0xf] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
      auVar233 = ~auVar325 & auVar233 | auVar313 & auVar325;
      uVar185 = uVar185 >> 8;
      uVar250 = (uVar221 - (uVar217 + uVar329)) + uVar232 + uVar183;
      uVar260 = (sStack_2b6 - (sVar182 + sVar370)) + sStack_e6 + uVar189;
      uVar262 = (sStack_2b4 - (sVar188 + sVar372)) + sStack_e4 + uVar193;
      uVar264 = (sStack_2b2 - (sVar192 + sVar374)) + sStack_e2 + uVar197;
      uVar266 = (sStack_2b0 - (sVar196 + sVar376)) + sStack_e0 + uVar201;
      uVar269 = (sStack_2ae - (sVar200 + sVar378)) + sStack_de + uVar206;
      uVar272 = (sStack_2ac - (sVar205 + sVar380)) + sStack_dc + uVar209;
      uVar249 = (uVar210 - (uVar202 + uVar185)) + uVar322 + uVar229;
      uVar183 = uVar183 >> 3;
      uVar189 = uVar189 >> 3;
      uVar193 = uVar193 >> 3;
      uVar197 = uVar197 >> 3;
      uVar201 = uVar201 >> 3;
      uVar206 = uVar206 >> 3;
      uVar209 = uVar209 >> 3;
      uVar229 = uVar229 >> 3;
      uVar259 = (uVar366 - (uVar228 + uVar324)) + uVar213 + uVar330;
      uVar263 = (uStack_2c6 - (uStack_2a6 + uVar270)) + uStack_f6 + uVar335;
      uVar268 = (uStack_2c4 - (uStack_2a4 + bVar244)) + uStack_f4 + uVar341;
      uVar273 = (uStack_2c2 - (uStack_2a2 + bVar245)) + uStack_f2 + uVar347;
      uVar332 = (uStack_2c0 - (uStack_2a0 + bVar246)) + uStack_f0 + uVar350;
      uVar338 = (uStack_2be - (uStack_29e + bVar247)) + uStack_ee + uVar367;
      uVar344 = (uStack_2bc - (uStack_29c + bVar248)) + uStack_ec + uVar371;
      uVar358 = (uStack_2ba - (uStack_29a + bVar293)) + uStack_ea + uVar373;
      uVar330 = uVar330 >> 3;
      uVar335 = uVar335 >> 3;
      uVar341 = uVar341 >> 3;
      uVar347 = uVar347 >> 3;
      uVar350 = uVar350 >> 3;
      uVar367 = uVar367 >> 3;
      uVar371 = uVar371 >> 3;
      uVar373 = uVar373 >> 3;
      auVar312[1] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
      auVar312[0] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
      auVar312[2] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar312[3] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
      auVar312[4] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar312[5] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
      auVar312[6] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
      auVar312[7] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar312[8] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
      auVar312[9] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
      auVar312[10] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar312[0xb] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
      auVar312[0xc] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
      auVar312[0xd] = (uVar367 != 0) * (uVar367 < 0x100) * (char)uVar367 - (0xff < uVar367);
      auVar312[0xe] = (uVar371 != 0) * (uVar371 < 0x100) * (char)uVar371 - (0xff < uVar371);
      auVar312[0xf] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
      auVar359 = ~auVar325 & auVar359 | auVar312 & auVar325;
      uVar317 = uVar317 >> 8;
      uVar229 = uVar250 >> 3;
      uVar183 = uVar260 >> 3;
      uVar189 = uVar262 >> 3;
      uVar193 = uVar264 >> 3;
      uVar197 = uVar266 >> 3;
      uVar201 = uVar269 >> 3;
      uVar206 = uVar272 >> 3;
      uVar209 = uVar249 >> 3;
      uVar261 = uVar259 >> 3;
      uVar265 = uVar263 >> 3;
      uVar271 = uVar268 >> 3;
      uVar330 = uVar273 >> 3;
      uVar335 = uVar332 >> 3;
      uVar341 = uVar338 >> 3;
      uVar347 = uVar344 >> 3;
      uVar350 = uVar358 >> 3;
      auVar257[1] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
      auVar257[0] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar257[2] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
      auVar257[3] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar257[4] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
      auVar257[5] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar257[6] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
      auVar257[7] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
      auVar257[8] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
      auVar257[9] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
      auVar257[10] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
      auVar257[0xb] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
      auVar257[0xc] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
      auVar257[0xd] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
      auVar257[0xe] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
      auVar257[0xf] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
      auVar172 = ~auVar325 & auVar225 | auVar257 & auVar325;
      uVar229 = (ushort)((uVar226 - (uVar221 + uVar212)) + uVar232 + uVar250) >> 3;
      uVar183 = (ushort)((sStack_266 - (sStack_2b6 + sVar216)) + sStack_e6 + uVar260) >> 3;
      uVar189 = (ushort)((sStack_264 - (sStack_2b4 + sVar218)) + sStack_e4 + uVar262) >> 3;
      uVar193 = (ushort)((sStack_262 - (sStack_2b2 + sVar219)) + sStack_e2 + uVar264) >> 3;
      uVar197 = (ushort)((sStack_260 - (sStack_2b0 + sVar220)) + sStack_e0 + uVar266) >> 3;
      uVar201 = (ushort)((sStack_25e - (sStack_2ae + sVar222)) + sStack_de + uVar269) >> 3;
      uVar206 = (ushort)((sStack_25c - (sStack_2ac + sVar223)) + sStack_dc + uVar272) >> 3;
      uVar209 = (ushort)((uVar168 - (uVar210 + uVar317)) + uVar322 + uVar249) >> 3;
      uVar250 = (ushort)((uVar311 - (uVar366 + uVar362)) + uVar213 + uVar259) >> 3;
      uVar260 = (ushort)((uStack_1c6 - (uStack_2c6 + uVar323)) + uStack_f6 + uVar263) >> 3;
      uVar262 = (ushort)((uStack_1c4 - (uStack_2c4 + uVar251)) + uStack_f4 + uVar268) >> 3;
      uVar264 = (ushort)((uStack_1c2 - (uStack_2c2 + uVar252)) + uStack_f2 + uVar273) >> 3;
      uVar266 = (ushort)((uStack_1c0 - (uStack_2c0 + uVar253)) + uStack_f0 + uVar332) >> 3;
      uVar269 = (ushort)((uStack_1be - (uStack_2be + uVar274)) + uStack_ee + uVar338) >> 3;
      uVar272 = (ushort)((uStack_1bc - (uStack_2bc + uVar327)) + uStack_ec + uVar344) >> 3;
      uVar249 = (ushort)((uStack_1ba - (uStack_2ba + bVar296)) + uStack_ea + uVar358) >> 3;
      auVar256[1] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
      auVar256[0] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
      auVar256[2] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
      auVar256[3] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
      auVar256[4] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
      auVar256[5] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
      auVar256[6] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
      auVar256[7] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
      auVar256[8] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
      auVar256[9] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
      auVar256[10] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
      auVar256[0xb] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
      auVar256[0xc] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
      auVar256[0xd] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
      auVar256[0xe] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
      auVar256[0xf] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
      local_1d8 = local_1d8 & auVar325;
      auVar225 = ~auVar325 & auVar175 | auVar256 & auVar325;
      auVar175 = psllw(local_1d8,7);
      if ((((((((((((((((auVar175 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar175 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar175 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar175 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar175 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar175 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar175 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar175 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar175 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar175 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar175 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar175 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar175 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar175 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar175 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar175[0xf]
         ) {
        local_188 = auVar173._0_8_;
        uStack_180 = auVar173._8_8_;
        *(undefined8 *)(s + lVar166 * -3) = local_188;
        *(undefined8 *)(s + lVar166 * -3 + 8) = uStack_180;
        local_198 = auVar174._0_8_;
        uStack_190 = auVar174._8_8_;
        *(undefined8 *)(s + lVar165) = local_198;
        *(undefined8 *)(s + lVar165 + 8) = uStack_190;
        *(undefined1 (*) [16])(s + lVar164) = auVar233;
        *(undefined1 (*) [16])s = auVar359;
        *(undefined1 (*) [16])(s + lVar166) = auVar172;
        local_248 = auVar225._0_8_;
        uStack_240 = auVar225._8_8_;
        *(undefined8 *)(s + lVar166 * 2) = local_248;
        *(undefined8 *)(s + lVar166 * 2 + 8) = uStack_240;
      }
      else {
        auVar10[0xd] = 0;
        auVar10._0_13_ = auVar215._0_13_;
        auVar10[0xe] = auVar215[7];
        uVar229 = auVar10._13_2_;
        auVar24[0xc] = auVar215[6];
        auVar24._0_12_ = auVar215._0_12_;
        auVar24._13_2_ = uVar229;
        auVar38[0xb] = 0;
        auVar38._0_11_ = auVar215._0_11_;
        auVar38._12_3_ = auVar24._12_3_;
        auVar52[10] = auVar215[5];
        auVar52._0_10_ = auVar215._0_10_;
        auVar52._11_4_ = auVar38._11_4_;
        auVar66[9] = 0;
        auVar66._0_9_ = auVar215._0_9_;
        auVar66._10_5_ = auVar52._10_5_;
        auVar80[8] = auVar215[4];
        auVar80._0_8_ = auVar215._0_8_;
        auVar80._9_6_ = auVar66._9_6_;
        auVar124._7_8_ = 0;
        auVar124._0_7_ = auVar80._8_7_;
        Var101 = CONCAT81(SUB158(auVar124 << 0x40,7),auVar215[3]);
        auVar152._9_6_ = 0;
        auVar152._0_9_ = Var101;
        auVar125._1_10_ = SUB1510(auVar152 << 0x30,5);
        auVar125[0] = auVar215[2];
        auVar153._11_4_ = 0;
        auVar153._0_11_ = auVar125;
        auVar94[2] = auVar215[1];
        auVar94._0_2_ = auVar215._0_2_;
        auVar94._3_12_ = SUB1512(auVar153 << 0x20,3);
        auVar314._0_2_ = auVar215._0_2_ & 0xff;
        auVar314._2_13_ = auVar94._2_13_;
        auVar314[0xf] = 0;
        auVar11[0xd] = 0;
        auVar11._0_13_ = auVar254._0_13_;
        auVar11[0xe] = auVar254[7];
        uVar183 = auVar11._13_2_;
        auVar25[0xc] = auVar254[6];
        auVar25._0_12_ = auVar254._0_12_;
        auVar25._13_2_ = uVar183;
        auVar39[0xb] = 0;
        auVar39._0_11_ = auVar254._0_11_;
        auVar39._12_3_ = auVar25._12_3_;
        auVar53[10] = auVar254[5];
        auVar53._0_10_ = auVar254._0_10_;
        auVar53._11_4_ = auVar39._11_4_;
        auVar67[9] = 0;
        auVar67._0_9_ = auVar254._0_9_;
        auVar67._10_5_ = auVar53._10_5_;
        auVar81[8] = auVar254[4];
        auVar81._0_8_ = auVar254._0_8_;
        auVar81._9_6_ = auVar67._9_6_;
        auVar126._7_8_ = 0;
        auVar126._0_7_ = auVar81._8_7_;
        Var104 = CONCAT81(SUB158(auVar126 << 0x40,7),auVar254[3]);
        auVar154._9_6_ = 0;
        auVar154._0_9_ = Var104;
        auVar127._1_10_ = SUB1510(auVar154 << 0x30,5);
        auVar127[0] = auVar254[2];
        auVar155._11_4_ = 0;
        auVar155._0_11_ = auVar127;
        auVar95[2] = auVar254[1];
        auVar95._0_2_ = auVar254._0_2_;
        auVar95._3_12_ = SUB1512(auVar155 << 0x20,3);
        uVar371 = auVar254._0_2_ & 0xff;
        auVar12[0xd] = 0;
        auVar12._0_13_ = auVar214._0_13_;
        auVar12[0xe] = auVar214[7];
        uVar189 = auVar12._13_2_;
        auVar26[0xc] = auVar214[6];
        auVar26._0_12_ = auVar214._0_12_;
        auVar26._13_2_ = uVar189;
        auVar40[0xb] = 0;
        auVar40._0_11_ = auVar214._0_11_;
        auVar40._12_3_ = auVar26._12_3_;
        auVar54[10] = auVar214[5];
        auVar54._0_10_ = auVar214._0_10_;
        auVar54._11_4_ = auVar40._11_4_;
        auVar68[9] = 0;
        auVar68._0_9_ = auVar214._0_9_;
        auVar68._10_5_ = auVar54._10_5_;
        auVar82[8] = auVar214[4];
        auVar82._0_8_ = auVar214._0_8_;
        auVar82._9_6_ = auVar68._9_6_;
        auVar128._7_8_ = 0;
        auVar128._0_7_ = auVar82._8_7_;
        Var107 = CONCAT81(SUB158(auVar128 << 0x40,7),auVar214[3]);
        auVar156._9_6_ = 0;
        auVar156._0_9_ = Var107;
        auVar129._1_10_ = SUB1510(auVar156 << 0x30,5);
        auVar129[0] = auVar214[2];
        auVar157._11_4_ = 0;
        auVar157._0_11_ = auVar129;
        auVar96[2] = auVar214[1];
        auVar96._0_2_ = auVar214._0_2_;
        auVar96._3_12_ = SUB1512(auVar157 << 0x20,3);
        uVar367 = auVar214._0_2_ & 0xff;
        auVar13[0xd] = 0;
        auVar13._0_13_ = auVar255._0_13_;
        auVar13[0xe] = auVar255[7];
        auVar27[0xc] = auVar255[6];
        auVar27._0_12_ = auVar255._0_12_;
        auVar27._13_2_ = auVar13._13_2_;
        auVar41[0xb] = 0;
        auVar41._0_11_ = auVar255._0_11_;
        auVar41._12_3_ = auVar27._12_3_;
        auVar55[10] = auVar255[5];
        auVar55._0_10_ = auVar255._0_10_;
        auVar55._11_4_ = auVar41._11_4_;
        auVar69[9] = 0;
        auVar69._0_9_ = auVar255._0_9_;
        auVar69._10_5_ = auVar55._10_5_;
        auVar83[8] = auVar255[4];
        auVar83._0_8_ = auVar255._0_8_;
        auVar83._9_6_ = auVar69._9_6_;
        auVar130._7_8_ = 0;
        auVar130._0_7_ = auVar83._8_7_;
        Var110 = CONCAT81(SUB158(auVar130 << 0x40,7),auVar255[3]);
        auVar158._9_6_ = 0;
        auVar158._0_9_ = Var110;
        auVar131._1_10_ = SUB1510(auVar158 << 0x30,5);
        auVar131[0] = auVar255[2];
        auVar159._11_4_ = 0;
        auVar159._0_11_ = auVar131;
        auVar97[2] = auVar255[1];
        auVar97._0_2_ = auVar255._0_2_;
        auVar97._3_12_ = SUB1512(auVar159 << 0x20,3);
        uVar251 = auVar255._0_2_ & 0xff;
        auVar14[0xd] = 0;
        auVar14._0_13_ = auVar331._0_13_;
        auVar14[0xe] = auVar331[7];
        auVar28[0xc] = auVar331[6];
        auVar28._0_12_ = auVar331._0_12_;
        auVar28._13_2_ = auVar14._13_2_;
        auVar42[0xb] = 0;
        auVar42._0_11_ = auVar331._0_11_;
        auVar42._12_3_ = auVar28._12_3_;
        auVar56[10] = auVar331[5];
        auVar56._0_10_ = auVar331._0_10_;
        auVar56._11_4_ = auVar42._11_4_;
        auVar70[9] = 0;
        auVar70._0_9_ = auVar331._0_9_;
        auVar70._10_5_ = auVar56._10_5_;
        auVar84[8] = auVar331[4];
        auVar84._0_8_ = auVar331._0_8_;
        auVar84._9_6_ = auVar70._9_6_;
        auVar132._7_8_ = 0;
        auVar132._0_7_ = auVar84._8_7_;
        Var113 = CONCAT81(SUB158(auVar132 << 0x40,7),auVar331[3]);
        auVar160._9_6_ = 0;
        auVar160._0_9_ = Var113;
        auVar133._1_10_ = SUB1510(auVar160 << 0x30,5);
        auVar133[0] = auVar331[2];
        auVar161._11_4_ = 0;
        auVar161._0_11_ = auVar133;
        auVar98[2] = auVar331[1];
        auVar98._0_2_ = auVar331._0_2_;
        auVar98._3_12_ = SUB1512(auVar161 << 0x20,3);
        uVar252 = auVar331._0_2_ & 0xff;
        auVar15[0xd] = 0;
        auVar15._0_13_ = auVar258._0_13_;
        auVar15[0xe] = auVar258[7];
        auVar29[0xc] = auVar258[6];
        auVar29._0_12_ = auVar258._0_12_;
        auVar29._13_2_ = auVar15._13_2_;
        auVar43[0xb] = 0;
        auVar43._0_11_ = auVar258._0_11_;
        auVar43._12_3_ = auVar29._12_3_;
        auVar57[10] = auVar258[5];
        auVar57._0_10_ = auVar258._0_10_;
        auVar57._11_4_ = auVar43._11_4_;
        auVar71[9] = 0;
        auVar71._0_9_ = auVar258._0_9_;
        auVar71._10_5_ = auVar57._10_5_;
        auVar85[8] = auVar258[4];
        auVar85._0_8_ = auVar258._0_8_;
        auVar85._9_6_ = auVar71._9_6_;
        auVar134._7_8_ = 0;
        auVar134._0_7_ = auVar85._8_7_;
        Var116 = CONCAT81(SUB158(auVar134 << 0x40,7),auVar258[3]);
        auVar162._9_6_ = 0;
        auVar162._0_9_ = Var116;
        auVar135._1_10_ = SUB1510(auVar162 << 0x30,5);
        auVar135[0] = auVar258[2];
        auVar163._11_4_ = 0;
        auVar163._0_11_ = auVar135;
        auVar99[2] = auVar258[1];
        auVar99._0_2_ = auVar258._0_2_;
        auVar99._3_12_ = SUB1512(auVar163 << 0x20,3);
        uVar274 = auVar258._0_2_ & 0xff;
        auVar363._0_2_ = CONCAT11(0,auVar215[8]);
        bVar297 = auVar215[9];
        auVar363[2] = bVar297;
        auVar363[3] = 0;
        bVar298 = auVar215[10];
        auVar363[4] = bVar298;
        auVar363[5] = 0;
        bVar299 = auVar215[0xb];
        auVar363[6] = bVar299;
        auVar363[7] = 0;
        bVar300 = auVar215[0xc];
        auVar363[8] = bVar300;
        auVar363[9] = 0;
        bVar301 = auVar215[0xd];
        auVar363[10] = bVar301;
        auVar363[0xb] = 0;
        bVar302 = auVar215[0xe];
        auVar363[0xc] = bVar302;
        auVar363[0xd] = 0;
        bVar303 = auVar215[0xf];
        auVar363[0xe] = bVar303;
        auVar363[0xf] = 0;
        uVar327 = (ushort)auVar254[8];
        uVar368 = (ushort)auVar214[8];
        uVar253 = (ushort)auVar258[8];
        uVar171 = uVar171 >> 8;
        sVar382 = auVar96._2_2_;
        sVar333 = auVar95._2_2_;
        sVar284 = auVar129._0_2_;
        sVar336 = auVar127._0_2_;
        sVar286 = (short)Var107;
        sVar339 = (short)Var104;
        sVar288 = auVar82._8_2_;
        sVar342 = auVar81._8_2_;
        sVar290 = auVar54._10_2_;
        sVar345 = auVar53._10_2_;
        sVar292 = auVar26._12_2_;
        sVar348 = auVar25._12_2_;
        auVar175 = psllw(auVar314,3);
        sVar315 = auVar94._2_2_;
        sVar316 = auVar125._0_2_;
        sVar318 = (short)Var101;
        sVar319 = auVar80._8_2_;
        sVar320 = auVar52._10_2_;
        sVar321 = auVar24._12_2_;
        uVar193 = uVar229 >> 8;
        uVar264 = (auVar175._0_2_ - auVar314._0_2_) + 8 +
                  uVar212 + uVar329 + uVar230 + uVar217 + uVar281 + (uVar367 + uVar371) * 2;
        uVar266 = (auVar175._2_2_ - sVar315) + 8 +
                  sVar216 + sVar370 + sVar275 + sVar182 + sVar282 + (sVar382 + sVar333) * 2;
        uVar269 = (auVar175._4_2_ - sVar316) + 8 +
                  sVar218 + sVar372 + sVar276 + sVar188 + sVar283 + (sVar284 + sVar336) * 2;
        uVar272 = (auVar175._6_2_ - sVar318) + 8 +
                  sVar219 + sVar374 + sVar277 + sVar192 + sVar285 + (sVar286 + sVar339) * 2;
        uVar249 = (auVar175._8_2_ - sVar319) + 8 +
                  sVar220 + sVar376 + sVar278 + sVar196 + sVar287 + (sVar288 + sVar342) * 2;
        uVar259 = (auVar175._10_2_ - sVar320) + 8 +
                  sVar222 + sVar378 + sVar279 + sVar200 + sVar289 + (sVar290 + sVar345) * 2;
        uVar261 = (auVar175._12_2_ - sVar321) + 8 +
                  sVar223 + sVar380 + sVar280 + sVar205 + sVar291 + (sVar292 + sVar348) * 2;
        uVar263 = (auVar175._14_2_ - uVar193) + 8 +
                  sVar224 + uVar171 + uVar202 + uVar169 + ((uVar189 >> 8) + (uVar183 >> 8)) * 2;
        uStack_166 = (ushort)auVar176[9];
        uStack_164 = (ushort)bVar309;
        uStack_162 = (ushort)bVar231;
        uStack_160 = (ushort)bVar234;
        uStack_15e = (ushort)bVar235;
        uStack_15c = (ushort)bVar236;
        uStack_15a = (ushort)bVar237;
        auVar175 = psllw(auVar363,3);
        uVar351 = (ushort)bVar297;
        uVar353 = (ushort)bVar298;
        uVar355 = (ushort)bVar299;
        uVar357 = (ushort)bVar300;
        uVar377 = (ushort)bVar301;
        uVar381 = (ushort)bVar302;
        uVar384 = (ushort)bVar303;
        uVar169 = (auVar175._0_2_ - auVar363._0_2_) + 8 +
                  uVar362 + uVar324 + uVar227 + uVar228 + uVar294 + (uVar368 + uVar327) * 2;
        uVar197 = (auVar175._2_2_ - uVar351) + 8 +
                  uVar323 + uVar270 + uStack_166 + uStack_2a6 + uVar267 +
                  ((ushort)auVar214[9] + (ushort)auVar254[9]) * 2;
        uVar201 = (auVar175._4_2_ - uVar353) + 8 +
                  sVar334 + uStack_164 + uStack_2a4 + bVar238 +
                  ((ushort)auVar214[10] + (ushort)auVar254[10]) * 2;
        uVar206 = (auVar175._6_2_ - uVar355) + 8 +
                  sVar337 + uStack_162 + uStack_2a2 + bVar239 +
                  ((ushort)auVar214[0xb] + (ushort)auVar254[0xb]) * 2;
        uVar209 = (auVar175._8_2_ - uVar357) + 8 +
                  sVar340 + uStack_160 + uStack_2a0 + bVar240 +
                  ((ushort)auVar214[0xc] + (ushort)auVar254[0xc]) * 2;
        uVar250 = (auVar175._10_2_ - uVar377) + 8 +
                  sVar343 + uStack_15e + uStack_29e + bVar241 +
                  ((ushort)auVar214[0xd] + (ushort)auVar254[0xd]) * 2;
        uVar260 = (auVar175._12_2_ - uVar381) + 8 +
                  sVar346 + uStack_15c + uStack_29c + bVar242 +
                  ((ushort)auVar214[0xe] + (ushort)auVar254[0xe]) * 2;
        uVar262 = (auVar175._14_2_ - uVar384) + 8 +
                  sVar349 + uStack_15a + uStack_29a + bVar243 +
                  ((ushort)auVar214[0xf] + (ushort)auVar254[0xf]) * 2;
        sVar224 = (short)Var110;
        uVar202 = auVar13._13_2_ >> 8;
        uStack_156 = (ushort)auVar179[9];
        uStack_154 = (ushort)bVar238;
        uStack_152 = (ushort)bVar239;
        uStack_150 = (ushort)bVar240;
        uStack_14e = (ushort)bVar241;
        uStack_14c = (ushort)bVar242;
        uStack_14a = (ushort)bVar243;
        uVar335 = uVar221 + uVar230 + auVar314._0_2_ * -2 + uVar264;
        uVar338 = sStack_2b6 + sVar275 + sVar315 * -2 + uVar266;
        uVar341 = sStack_2b4 + sVar276 + sVar316 * -2 + uVar269;
        uVar344 = sStack_2b2 + sVar277 + sVar318 * -2 + uVar272;
        uVar347 = sStack_2b0 + sVar278 + sVar319 * -2 + uVar249;
        uVar358 = sStack_2ae + sVar279 + sVar320 * -2 + uVar259;
        uVar350 = sStack_2ac + sVar280 + sVar321 * -2 + uVar261;
        uVar323 = uVar210 + uVar171 + uVar193 * -2 + uVar263;
        uVar264 = uVar264 >> 4;
        uVar266 = uVar266 >> 4;
        uVar269 = uVar269 >> 4;
        uVar272 = uVar272 >> 4;
        uVar249 = uVar249 >> 4;
        uVar259 = uVar259 >> 4;
        uVar261 = uVar261 >> 4;
        uVar263 = uVar263 >> 4;
        uVar265 = uVar366 + uVar227 + auVar363._0_2_ * -2 + uVar169;
        uVar268 = uStack_2c6 + uStack_166 + uVar351 * -2 + uVar197;
        uVar271 = ((uStack_2c4 + uStack_164) - (bVar298 + uVar353)) + uVar201;
        uVar273 = ((uStack_2c2 + uStack_162) - (bVar299 + uVar355)) + uVar206;
        uVar267 = ((uStack_2c0 + uStack_160) - (bVar300 + uVar357)) + uVar209;
        uVar270 = ((uStack_2be + uStack_15e) - (bVar301 + uVar377)) + uVar250;
        uVar330 = ((uStack_2bc + uStack_15c) - (bVar302 + uVar381)) + uVar260;
        uVar332 = ((uStack_2ba + uStack_15a) - (bVar303 + uVar384)) + uVar262;
        uVar169 = uVar169 >> 4;
        uVar197 = uVar197 >> 4;
        uVar201 = uVar201 >> 4;
        uVar206 = uVar206 >> 4;
        uVar209 = uVar209 >> 4;
        uVar250 = uVar250 >> 4;
        uVar260 = uVar260 >> 4;
        uVar262 = uVar262 >> 4;
        auVar175[1] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
        auVar175[0] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        auVar175[2] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar175[3] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
        auVar175[4] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        auVar175[5] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
        auVar175[6] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
        auVar175[7] = (uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263);
        auVar175[8] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar175[9] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar175[10] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar175[0xb] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar175[0xc] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar175[0xd] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar175[0xe] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar175[0xf] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        *(undefined1 (*) [16])(s + lVar166 * -6) = ~local_1d8 & auVar254 | auVar175 & local_1d8;
        sStack_276 = auVar98._2_2_;
        sStack_274 = auVar133._0_2_;
        sStack_272 = (short)Var113;
        sStack_270 = auVar84._8_2_;
        sStack_26e = auVar56._10_2_;
        sStack_26c = auVar28._12_2_;
        uVar169 = auVar14._13_2_ >> 8;
        uStack_136 = (ushort)auVar177[9];
        uStack_134 = (ushort)bVar244;
        uStack_132 = (ushort)bVar245;
        uStack_130 = (ushort)bVar246;
        uStack_12e = (ushort)bVar247;
        uStack_12c = (ushort)bVar248;
        uStack_12a = (ushort)bVar293;
        uStack_1a6 = (ushort)auVar254[9];
        uStack_1a4 = (ushort)auVar254[10];
        uStack_1a2 = (ushort)auVar254[0xb];
        uStack_1a0 = (ushort)auVar254[0xc];
        uStack_19e = (ushort)auVar254[0xd];
        uStack_19c = (ushort)auVar254[0xe];
        uStack_19a = (ushort)auVar254[0xf];
        uStack_2d6 = (ushort)auVar331[9];
        uStack_2d4 = (ushort)auVar331[10];
        uStack_2d2 = (ushort)auVar331[0xb];
        uStack_2d0 = (ushort)auVar331[0xc];
        uStack_2ce = (ushort)auVar331[0xd];
        uStack_2cc = (ushort)auVar331[0xe];
        uStack_2ca = (ushort)auVar331[0xf];
        uVar373 = ((uVar329 + uVar226) - (uVar371 + auVar314._0_2_)) + uVar335;
        uVar352 = ((sVar370 + sStack_266) - (sVar333 + sVar315)) + uVar338;
        uVar354 = ((sVar372 + sStack_264) - (sVar336 + sVar316)) + uVar341;
        uVar356 = ((sVar374 + sStack_262) - (sVar339 + sVar318)) + uVar344;
        uVar375 = ((sVar376 + sStack_260) - (sVar342 + sVar319)) + uVar347;
        uVar379 = ((sVar378 + sStack_25e) - (sVar345 + sVar320)) + uVar358;
        uVar383 = ((sVar380 + sStack_25c) - (sVar348 + sVar321)) + uVar350;
        uVar365 = ((uVar185 + uVar168) - ((uVar183 >> 8) + uVar193)) + uVar323;
        uVar335 = uVar335 >> 4;
        uVar338 = uVar338 >> 4;
        uVar341 = uVar341 >> 4;
        uVar344 = uVar344 >> 4;
        uVar347 = uVar347 >> 4;
        uVar358 = uVar358 >> 4;
        uVar350 = uVar350 >> 4;
        uVar323 = uVar323 >> 4;
        uVar369 = ((uVar324 + uVar311) - (uVar327 + auVar363._0_2_)) + uVar265;
        uVar351 = ((uStack_136 + uStack_1c6) - (uStack_1a6 + uVar351)) + uVar268;
        uVar353 = ((uStack_134 + uStack_1c4) - (uStack_1a4 + uVar353)) + uVar271;
        uVar355 = ((uStack_132 + uStack_1c2) - (uStack_1a2 + uVar355)) + uVar273;
        uVar357 = ((uStack_130 + uStack_1c0) - (uStack_1a0 + uVar357)) + uVar267;
        uVar377 = ((uStack_12e + uStack_1be) - (uStack_19e + uVar377)) + uVar270;
        uVar381 = ((uStack_12c + uStack_1bc) - (uStack_19c + uVar381)) + uVar330;
        uVar384 = ((uStack_12a + uStack_1ba) - (uStack_19a + uVar384)) + uVar332;
        uVar265 = uVar265 >> 4;
        uVar268 = uVar268 >> 4;
        uVar271 = uVar271 >> 4;
        uVar273 = uVar273 >> 4;
        uVar267 = uVar267 >> 4;
        uVar270 = uVar270 >> 4;
        uVar330 = uVar330 >> 4;
        uVar332 = uVar332 >> 4;
        auVar215[1] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar215[0] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
        auVar215[2] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
        auVar215[3] = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
        auVar215[4] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
        auVar215[5] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
        auVar215[6] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
        auVar215[7] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        auVar215[8] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
        auVar215[9] = (uVar268 != 0) * (uVar268 < 0x100) * (char)uVar268 - (0xff < uVar268);
        auVar215[10] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
        auVar215[0xb] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
        auVar215[0xc] = (uVar267 != 0) * (uVar267 < 0x100) * (char)uVar267 - (0xff < uVar267);
        auVar215[0xd] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
        auVar215[0xe] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
        auVar215[0xf] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
        *(undefined1 (*) [16])(s + lVar166 * -5) = ~local_1d8 & auVar214 | auVar215 & local_1d8;
        uVar229 = uVar229 >> 8;
        sStack_86 = auVar99._2_2_;
        sStack_84 = auVar135._0_2_;
        sStack_82 = (short)Var116;
        sStack_80 = auVar85._8_2_;
        sStack_7e = auVar57._10_2_;
        sStack_7c = auVar29._12_2_;
        uVar193 = auVar15._13_2_ >> 8;
        uStack_96 = (ushort)auVar214[9];
        uStack_94 = (ushort)auVar214[10];
        uStack_92 = (ushort)auVar214[0xb];
        uStack_90 = (ushort)auVar214[0xc];
        uStack_8e = (ushort)auVar214[0xd];
        uStack_8c = (ushort)auVar214[0xe];
        uStack_8a = (ushort)auVar214[0xf];
        uStack_256 = (ushort)bVar295;
        uStack_254 = (ushort)auVar178[10];
        uStack_252 = (ushort)auVar178[0xb];
        uStack_250 = (ushort)auVar178[0xc];
        uStack_24e = (ushort)auVar178[0xd];
        uStack_24c = (ushort)auVar178[0xe];
        uStack_24a = (ushort)bVar296;
        uStack_216 = (ushort)bVar297;
        uStack_214 = (ushort)bVar298;
        uStack_212 = (ushort)bVar299;
        uStack_210 = (ushort)bVar300;
        uStack_20e = (ushort)bVar301;
        uStack_20c = (ushort)bVar302;
        uStack_20a = (ushort)bVar303;
        uStack_206 = (ushort)auVar258[9];
        uStack_204 = (ushort)auVar258[10];
        uStack_202 = (ushort)auVar258[0xb];
        uStack_200 = (ushort)auVar258[0xc];
        uStack_1fe = (ushort)auVar258[0xd];
        uStack_1fc = (ushort)auVar258[0xe];
        uStack_1fa = (ushort)auVar258[0xf];
        uVar197 = ((uVar212 + uVar232) - (uVar367 + auVar314._0_2_)) + uVar373;
        uVar201 = ((sVar216 + sStack_e6) - (sVar382 + sVar315)) + uVar352;
        uVar206 = ((sVar218 + sStack_e4) - (sVar284 + sVar316)) + uVar354;
        uVar209 = ((sVar219 + sStack_e2) - (sVar286 + sVar318)) + uVar356;
        uVar250 = ((sVar220 + sStack_e0) - (sVar288 + sVar319)) + uVar375;
        uVar260 = ((sVar222 + sStack_de) - (sVar290 + sVar320)) + uVar379;
        uVar262 = ((sVar223 + sStack_dc) - (sVar292 + sVar321)) + uVar383;
        uVar264 = ((uVar317 + uVar322) - ((uVar189 >> 8) + uVar229)) + uVar365;
        uVar373 = uVar373 >> 4;
        uVar352 = uVar352 >> 4;
        uVar354 = uVar354 >> 4;
        uVar356 = uVar356 >> 4;
        uVar375 = uVar375 >> 4;
        uVar379 = uVar379 >> 4;
        uVar383 = uVar383 >> 4;
        uVar365 = uVar365 >> 4;
        uVar266 = ((uVar362 + uVar213) - (uVar368 + auVar363._0_2_)) + uVar369;
        uVar269 = ((uStack_256 + uStack_f6) - (uStack_96 + uStack_216)) + uVar351;
        uVar272 = ((uStack_254 + uStack_f4) - (uStack_94 + uStack_214)) + uVar353;
        uVar249 = ((uStack_252 + uStack_f2) - (uStack_92 + uStack_212)) + uVar355;
        uVar259 = ((uStack_250 + uStack_f0) - (uStack_90 + uStack_210)) + uVar357;
        uVar261 = ((uStack_24e + uStack_ee) - (uStack_8e + uStack_20e)) + uVar377;
        uVar263 = ((uStack_24c + uStack_ec) - (uStack_8c + uStack_20c)) + uVar381;
        uVar265 = ((uStack_24a + uStack_ea) - (uStack_8a + uStack_20a)) + uVar384;
        uVar369 = uVar369 >> 4;
        uVar351 = uVar351 >> 4;
        uVar353 = uVar353 >> 4;
        uVar355 = uVar355 >> 4;
        uVar357 = uVar357 >> 4;
        uVar377 = uVar377 >> 4;
        uVar381 = uVar381 >> 4;
        uVar384 = uVar384 >> 4;
        auVar364[1] = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
        auVar364[0] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        auVar364[2] = (uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 - (0xff < uVar354);
        auVar364[3] = (uVar356 != 0) * (uVar356 < 0x100) * (char)uVar356 - (0xff < uVar356);
        auVar364[4] = (uVar375 != 0) * (uVar375 < 0x100) * (char)uVar375 - (0xff < uVar375);
        auVar364[5] = (uVar379 != 0) * (uVar379 < 0x100) * (char)uVar379 - (0xff < uVar379);
        auVar364[6] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
        auVar364[7] = (uVar365 != 0) * (uVar365 < 0x100) * (char)uVar365 - (0xff < uVar365);
        auVar364[8] = (uVar369 != 0) * (uVar369 < 0x100) * (char)uVar369 - (0xff < uVar369);
        auVar364[9] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
        auVar364[10] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
        auVar364[0xb] = (uVar355 != 0) * (uVar355 < 0x100) * (char)uVar355 - (0xff < uVar355);
        auVar364[0xc] = (uVar357 != 0) * (uVar357 < 0x100) * (char)uVar357 - (0xff < uVar357);
        auVar364[0xd] = (uVar377 != 0) * (uVar377 < 0x100) * (char)uVar377 - (0xff < uVar377);
        auVar364[0xe] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
        auVar364[0xf] = (uVar384 != 0) * (uVar384 < 0x100) * (char)uVar384 - (0xff < uVar384);
        *(undefined1 (*) [16])(s + lVar166 * -4) = ~local_1d8 & auVar176 | auVar364 & local_1d8;
        uVar268 = ((uVar281 + uVar251) - (uVar230 + auVar314._0_2_)) + uVar197;
        uVar271 = ((sVar282 + auVar97._2_2_) - (sVar275 + sVar315)) + uVar201;
        uVar273 = ((sVar283 + auVar131._0_2_) - (sVar276 + sVar316)) + uVar206;
        uVar267 = ((sVar285 + sVar224) - (sVar277 + sVar318)) + uVar209;
        uVar270 = ((sVar287 + auVar83._8_2_) - (sVar278 + sVar319)) + uVar250;
        uVar330 = ((sVar289 + auVar55._10_2_) - (sVar279 + sVar320)) + uVar260;
        uVar332 = ((sVar291 + auVar27._12_2_) - (sVar280 + sVar321)) + uVar262;
        uVar335 = (((uVar170 >> 8) + uVar202) - (uVar171 + uVar229)) + uVar264;
        uVar197 = uVar197 >> 4;
        uVar201 = uVar201 >> 4;
        uVar206 = uVar206 >> 4;
        uVar209 = uVar209 >> 4;
        uVar250 = uVar250 >> 4;
        uVar260 = uVar260 >> 4;
        uVar262 = uVar262 >> 4;
        uVar264 = uVar264 >> 4;
        uVar338 = ((uVar294 + auVar255[8]) - (uVar227 + auVar363._0_2_)) + uVar266;
        uVar341 = ((uStack_156 + auVar255[9]) - (uStack_166 + uStack_216)) + uVar269;
        uVar344 = ((uStack_154 + auVar255[10]) - (uStack_164 + uStack_214)) + uVar272;
        uVar347 = ((uStack_152 + auVar255[0xb]) - (uStack_162 + uStack_212)) + uVar249;
        uVar358 = ((uStack_150 + auVar255[0xc]) - (uStack_160 + uStack_210)) + uVar259;
        uVar350 = ((uStack_14e + auVar255[0xd]) - (uStack_15e + uStack_20e)) + uVar261;
        uVar323 = ((uStack_14c + auVar255[0xe]) - (uStack_15c + uStack_20c)) + uVar263;
        uVar373 = ((uStack_14a + auVar255[0xf]) - (uStack_15a + uStack_20a)) + uVar265;
        uVar266 = uVar266 >> 4;
        uVar269 = uVar269 >> 4;
        uVar272 = uVar272 >> 4;
        uVar249 = uVar249 >> 4;
        uVar259 = uVar259 >> 4;
        uVar261 = uVar261 >> 4;
        uVar263 = uVar263 >> 4;
        uVar265 = uVar265 >> 4;
        auVar258[1] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar258[0] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar258[2] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar258[3] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar258[4] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar258[5] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar258[6] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar258[7] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        auVar258[8] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
        auVar258[9] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar258[10] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
        auVar258[0xb] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        auVar258[0xc] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
        auVar258[0xd] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
        auVar258[0xe] = (uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263);
        auVar258[0xf] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
        *(undefined1 (*) [16])(s + lVar166 * -3) = ~local_1d8 & auVar173 | auVar258 & local_1d8;
        uVar269 = ((uVar217 + uVar252) - (uVar329 + auVar314._0_2_)) + uVar268;
        uVar249 = ((sVar182 + sStack_276) - (sVar370 + sVar315)) + uVar271;
        uVar261 = ((sVar188 + sStack_274) - (sVar372 + sVar316)) + uVar273;
        uVar265 = ((sVar192 + sStack_272) - (sVar374 + sVar318)) + uVar267;
        uVar351 = ((sVar196 + sStack_270) - (sVar376 + sVar319)) + uVar270;
        uVar352 = ((sVar200 + sStack_26e) - (sVar378 + sVar320)) + uVar330;
        uVar353 = ((sVar205 + sStack_26c) - (sVar380 + sVar321)) + uVar332;
        uVar354 = (((uVar184 >> 8) + uVar169) - (uVar185 + uVar229)) + uVar335;
        uVar268 = uVar268 >> 4;
        uVar271 = uVar271 >> 4;
        uVar273 = uVar273 >> 4;
        uVar267 = uVar267 >> 4;
        uVar270 = uVar270 >> 4;
        uVar330 = uVar330 >> 4;
        uVar332 = uVar332 >> 4;
        uVar335 = uVar335 >> 4;
        uVar197 = ((uVar228 + auVar331[8]) - (uVar324 + auVar363._0_2_)) + uVar338;
        uVar201 = ((uStack_2a6 + uStack_2d6) - (uStack_136 + uStack_216)) + uVar341;
        uVar206 = ((uStack_2a4 + uStack_2d4) - (uStack_134 + uStack_214)) + uVar344;
        uVar209 = ((uStack_2a2 + uStack_2d2) - (uStack_132 + uStack_212)) + uVar347;
        uVar250 = ((uStack_2a0 + uStack_2d0) - (uStack_130 + uStack_210)) + uVar358;
        uVar260 = ((uStack_29e + uStack_2ce) - (uStack_12e + uStack_20e)) + uVar350;
        uVar262 = ((uStack_29c + uStack_2cc) - (uStack_12c + uStack_20c)) + uVar323;
        uVar264 = ((uStack_29a + uStack_2ca) - (uStack_12a + uStack_20a)) + uVar373;
        uVar338 = uVar338 >> 4;
        uVar341 = uVar341 >> 4;
        uVar344 = uVar344 >> 4;
        uVar347 = uVar347 >> 4;
        uVar358 = uVar358 >> 4;
        uVar350 = uVar350 >> 4;
        uVar323 = uVar323 >> 4;
        uVar373 = uVar373 >> 4;
        auVar328[1] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
        auVar328[0] = (uVar268 != 0) * (uVar268 < 0x100) * (char)uVar268 - (0xff < uVar268);
        auVar328[2] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
        auVar328[3] = (uVar267 != 0) * (uVar267 < 0x100) * (char)uVar267 - (0xff < uVar267);
        auVar328[4] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
        auVar328[5] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
        auVar328[6] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
        auVar328[7] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
        auVar328[8] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar328[9] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
        auVar328[10] = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
        auVar328[0xb] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
        auVar328[0xc] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
        auVar328[0xd] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
        auVar328[0xe] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        auVar328[0xf] = (uVar373 != 0) * (uVar373 < 0x100) * (char)uVar373 - (0xff < uVar373);
        *(undefined1 (*) [16])(s + lVar165) = ~local_1d8 & auVar174 | auVar328 & local_1d8;
        uVar266 = ((uVar221 + uVar274) - (auVar314._0_2_ + uVar212)) + uVar269;
        uVar272 = ((sStack_2b6 + sStack_86) - (sVar315 + sVar216)) + uVar249;
        uVar259 = ((sStack_2b4 + sStack_84) - (sVar316 + sVar218)) + uVar261;
        uVar263 = ((sStack_2b2 + sStack_82) - (sVar318 + sVar219)) + uVar265;
        uVar268 = ((sStack_2b0 + sStack_80) - (sVar319 + sVar220)) + uVar351;
        uVar273 = ((sStack_2ae + sStack_7e) - (sVar320 + sVar222)) + uVar352;
        uVar270 = ((sStack_2ac + sStack_7c) - (sVar321 + sVar223)) + uVar353;
        uVar332 = ((uVar210 + uVar193) - (uVar229 + uVar317)) + uVar354;
        uVar269 = uVar269 >> 4;
        uVar249 = uVar249 >> 4;
        uVar261 = uVar261 >> 4;
        uVar265 = uVar265 >> 4;
        uVar351 = uVar351 >> 4;
        uVar352 = uVar352 >> 4;
        uVar353 = uVar353 >> 4;
        uVar354 = uVar354 >> 4;
        uVar335 = ((uVar366 + uVar253) - (auVar363._0_2_ + uVar362)) + uVar197;
        uVar338 = ((uStack_2c6 + uStack_206) - (uStack_216 + uStack_256)) + uVar201;
        uVar341 = ((uStack_2c4 + uStack_204) - (uStack_214 + uStack_254)) + uVar206;
        uVar344 = ((uStack_2c2 + uStack_202) - (uStack_212 + uStack_252)) + uVar209;
        uVar347 = ((uStack_2c0 + uStack_200) - (uStack_210 + uStack_250)) + uVar250;
        uVar358 = ((uStack_2be + uStack_1fe) - (uStack_20e + uStack_24e)) + uVar260;
        uVar350 = ((uStack_2bc + uStack_1fc) - (uStack_20c + uStack_24c)) + uVar262;
        uVar323 = ((uStack_2ba + uStack_1fa) - (uStack_20a + uStack_24a)) + uVar264;
        uVar197 = uVar197 >> 4;
        uVar201 = uVar201 >> 4;
        uVar206 = uVar206 >> 4;
        uVar209 = uVar209 >> 4;
        uVar250 = uVar250 >> 4;
        uVar260 = uVar260 >> 4;
        uVar262 = uVar262 >> 4;
        uVar264 = uVar264 >> 4;
        auVar360[1] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        auVar360[0] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar360[2] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
        auVar360[3] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
        auVar360[4] = (uVar351 != 0) * (uVar351 < 0x100) * (char)uVar351 - (0xff < uVar351);
        auVar360[5] = (uVar352 != 0) * (uVar352 < 0x100) * (char)uVar352 - (0xff < uVar352);
        auVar360[6] = (uVar353 != 0) * (uVar353 < 0x100) * (char)uVar353 - (0xff < uVar353);
        auVar360[7] = (uVar354 != 0) * (uVar354 < 0x100) * (char)uVar354 - (0xff < uVar354);
        auVar360[8] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar360[9] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar360[10] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar360[0xb] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar360[0xc] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar360[0xd] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar360[0xe] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar360[0xf] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        *(undefined1 (*) [16])(s + lVar164) = ~local_1d8 & auVar233 | auVar360 & local_1d8;
        uVar229 = uVar266 >> 4;
        uVar197 = uVar272 >> 4;
        uVar201 = uVar259 >> 4;
        uVar206 = uVar263 >> 4;
        uVar209 = uVar268 >> 4;
        uVar250 = uVar273 >> 4;
        uVar260 = uVar270 >> 4;
        uVar262 = uVar332 >> 4;
        uVar264 = uVar335 >> 4;
        uVar269 = uVar338 >> 4;
        uVar249 = uVar341 >> 4;
        uVar261 = uVar344 >> 4;
        uVar265 = uVar347 >> 4;
        uVar271 = uVar358 >> 4;
        uVar267 = uVar350 >> 4;
        uVar330 = uVar323 >> 4;
        auVar176[1] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar176[0] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
        auVar176[2] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar176[3] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar176[4] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar176[5] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar176[6] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar176[7] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar176[8] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        auVar176[9] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar176[10] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        auVar176[0xb] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
        auVar176[0xc] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
        auVar176[0xd] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
        auVar176[0xe] = (uVar267 != 0) * (uVar267 < 0x100) * (char)uVar267 - (0xff < uVar267);
        auVar176[0xf] = (uVar330 != 0) * (uVar330 < 0x100) * (char)uVar330 - (0xff < uVar330);
        *(undefined1 (*) [16])s = ~local_1d8 & auVar359 | auVar176 & local_1d8;
        uVar266 = (uVar226 - (uVar371 + uVar281)) + uVar274 + uVar266;
        uVar272 = (sStack_266 - (sVar333 + sVar282)) + sStack_86 + uVar272;
        uVar259 = (sStack_264 - (sVar336 + sVar283)) + sStack_84 + uVar259;
        uVar263 = (sStack_262 - (sVar339 + sVar285)) + sStack_82 + uVar263;
        uVar268 = (sStack_260 - (sVar342 + sVar287)) + sStack_80 + uVar268;
        uVar273 = (sStack_25e - (sVar345 + sVar289)) + sStack_7e + uVar273;
        uVar270 = (sStack_25c - (sVar348 + sVar291)) + sStack_7c + uVar270;
        uVar332 = (uVar168 - ((uVar183 >> 8) + (uVar170 >> 8))) + uVar193 + uVar332;
        uVar335 = (uVar311 - (uVar327 + uVar294)) + uVar253 + uVar335;
        uVar338 = (uStack_1c6 - (uStack_1a6 + uStack_156)) + uStack_206 + uVar338;
        uVar341 = (uStack_1c4 - (uStack_1a4 + uStack_154)) + uStack_204 + uVar341;
        uVar344 = (uStack_1c2 - (uStack_1a2 + uStack_152)) + uStack_202 + uVar344;
        uVar347 = (uStack_1c0 - (uStack_1a0 + uStack_150)) + uStack_200 + uVar347;
        uVar358 = (uStack_1be - (uStack_19e + uStack_14e)) + uStack_1fe + uVar358;
        uVar350 = (uStack_1bc - (uStack_19c + uStack_14c)) + uStack_1fc + uVar350;
        uVar323 = (uStack_1ba - (uStack_19a + uStack_14a)) + uStack_1fa + uVar323;
        uVar170 = uVar266 >> 4;
        uVar229 = uVar272 >> 4;
        uVar183 = uVar259 >> 4;
        uVar197 = uVar263 >> 4;
        uVar201 = uVar268 >> 4;
        uVar206 = uVar273 >> 4;
        uVar209 = uVar270 >> 4;
        uVar250 = uVar332 >> 4;
        uVar260 = uVar335 >> 4;
        uVar262 = uVar338 >> 4;
        uVar264 = uVar341 >> 4;
        uVar269 = uVar344 >> 4;
        uVar249 = uVar347 >> 4;
        uVar261 = uVar358 >> 4;
        uVar265 = uVar350 >> 4;
        uVar271 = uVar323 >> 4;
        auVar177[1] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
        auVar177[0] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar177[2] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar177[3] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar177[4] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar177[5] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar177[6] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar177[7] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar177[8] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar177[9] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar177[10] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        auVar177[0xb] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar177[0xc] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        auVar177[0xd] = (uVar261 != 0) * (uVar261 < 0x100) * (char)uVar261 - (0xff < uVar261);
        auVar177[0xe] = (uVar265 != 0) * (uVar265 < 0x100) * (char)uVar265 - (0xff < uVar265);
        auVar177[0xf] = (uVar271 != 0) * (uVar271 < 0x100) * (char)uVar271 - (0xff < uVar271);
        *(undefined1 (*) [16])(s + lVar166) = ~local_1d8 & auVar172 | auVar177 & local_1d8;
        uVar266 = (uVar232 - (uVar367 + uVar217)) + uVar274 + uVar266;
        uVar272 = (sStack_e6 - (sVar382 + sVar182)) + sStack_86 + uVar272;
        uVar259 = (sStack_e4 - (sVar284 + sVar188)) + sStack_84 + uVar259;
        uVar263 = (sStack_e2 - (sVar286 + sVar192)) + sStack_82 + uVar263;
        uVar268 = (sStack_e0 - (sVar288 + sVar196)) + sStack_80 + uVar268;
        uVar273 = (sStack_de - (sVar290 + sVar200)) + sStack_7e + uVar273;
        uVar270 = (sStack_dc - (sVar292 + sVar205)) + sStack_7c + uVar270;
        uVar332 = (uVar322 - ((uVar189 >> 8) + (uVar184 >> 8))) + uVar193 + uVar332;
        uVar335 = (uVar213 - (uVar368 + uVar228)) + uVar253 + uVar335;
        uVar338 = (uStack_f6 - (uStack_96 + uStack_2a6)) + uStack_206 + uVar338;
        uVar341 = (uStack_f4 - (uStack_94 + uStack_2a4)) + uStack_204 + uVar341;
        uVar344 = (uStack_f2 - (uStack_92 + uStack_2a2)) + uStack_202 + uVar344;
        uVar347 = (uStack_f0 - (uStack_90 + uStack_2a0)) + uStack_200 + uVar347;
        uVar358 = (uStack_ee - (uStack_8e + uStack_29e)) + uStack_1fe + uVar358;
        uVar350 = (uStack_ec - (uStack_8c + uStack_29c)) + uStack_1fc + uVar350;
        uVar323 = (uStack_ea - (uStack_8a + uStack_29a)) + uStack_1fa + uVar323;
        uVar170 = uVar266 >> 4;
        uVar184 = uVar272 >> 4;
        uVar229 = uVar259 >> 4;
        uVar183 = uVar263 >> 4;
        uVar189 = uVar268 >> 4;
        uVar197 = uVar273 >> 4;
        uVar201 = uVar270 >> 4;
        uVar206 = uVar332 >> 4;
        uVar209 = uVar335 >> 4;
        uVar217 = uVar338 >> 4;
        uVar250 = uVar341 >> 4;
        uVar260 = uVar344 >> 4;
        uVar262 = uVar347 >> 4;
        uVar264 = uVar358 >> 4;
        uVar269 = uVar350 >> 4;
        uVar249 = uVar323 >> 4;
        auVar178[1] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
        auVar178[0] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar178[2] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
        auVar178[3] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar178[4] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
        auVar178[5] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar178[6] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar178[7] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar178[8] = (uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 - (0xff < uVar209);
        auVar178[9] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
        auVar178[10] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar178[0xb] = (uVar260 != 0) * (uVar260 < 0x100) * (char)uVar260 - (0xff < uVar260);
        auVar178[0xc] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar178[0xd] = (uVar264 != 0) * (uVar264 < 0x100) * (char)uVar264 - (0xff < uVar264);
        auVar178[0xe] = (uVar269 != 0) * (uVar269 < 0x100) * (char)uVar269 - (0xff < uVar269);
        auVar178[0xf] = (uVar249 != 0) * (uVar249 < 0x100) * (char)uVar249 - (0xff < uVar249);
        *(undefined1 (*) [16])(s + lVar166 * 2) = ~local_1d8 & auVar225 | auVar178 & local_1d8;
        uVar266 = (uVar251 - (uVar221 + uVar230)) + uVar274 + uVar266;
        uVar272 = (auVar97._2_2_ - (sStack_2b6 + sVar275)) + sStack_86 + uVar272;
        uVar259 = (auVar131._0_2_ - (sStack_2b4 + sVar276)) + sStack_84 + uVar259;
        uVar263 = (sVar224 - (sStack_2b2 + sVar277)) + sStack_82 + uVar263;
        uVar268 = (auVar83._8_2_ - (sStack_2b0 + sVar278)) + sStack_80 + uVar268;
        uVar273 = (auVar55._10_2_ - (sStack_2ae + sVar279)) + sStack_7e + uVar273;
        uVar270 = (auVar27._12_2_ - (sStack_2ac + sVar280)) + sStack_7c + uVar270;
        uVar332 = (uVar202 - (uVar210 + uVar171)) + uVar193 + uVar332;
        uVar335 = ((ushort)auVar255[8] - (uVar366 + uVar227)) + uVar253 + uVar335;
        uVar338 = ((ushort)auVar255[9] - (uStack_2c6 + uStack_166)) + uStack_206 + uVar338;
        uVar341 = ((ushort)auVar255[10] - (uStack_2c4 + uStack_164)) + uStack_204 + uVar341;
        uVar344 = ((ushort)auVar255[0xb] - (uStack_2c2 + uStack_162)) + uStack_202 + uVar344;
        uVar347 = ((ushort)auVar255[0xc] - (uStack_2c0 + uStack_160)) + uStack_200 + uVar347;
        uVar358 = ((ushort)auVar255[0xd] - (uStack_2be + uStack_15e)) + uStack_1fe + uVar358;
        uVar350 = ((ushort)auVar255[0xe] - (uStack_2bc + uStack_15c)) + uStack_1fc + uVar350;
        uVar323 = ((ushort)auVar255[0xf] - (uStack_2ba + uStack_15a)) + uStack_1fa + uVar323;
        uVar183 = (uVar252 - (uVar329 + uVar226)) + uVar274 + uVar266;
        uVar189 = (sStack_276 - (sVar370 + sStack_266)) + sStack_86 + uVar272;
        uVar201 = (sStack_274 - (sVar372 + sStack_264)) + sStack_84 + uVar259;
        uVar209 = (sStack_272 - (sVar374 + sStack_262)) + sStack_82 + uVar263;
        uVar221 = (sStack_270 - (sVar376 + sStack_260)) + sStack_80 + uVar268;
        uVar260 = (sStack_26e - (sVar378 + sStack_25e)) + sStack_7e + uVar273;
        uVar264 = (sStack_26c - (sVar380 + sStack_25c)) + sStack_7c + uVar270;
        uVar269 = (uVar169 - (uVar185 + uVar168)) + uVar193 + uVar332;
        uVar266 = uVar266 >> 4;
        uVar272 = uVar272 >> 4;
        uVar259 = uVar259 >> 4;
        uVar263 = uVar263 >> 4;
        uVar268 = uVar268 >> 4;
        uVar273 = uVar273 >> 4;
        uVar270 = uVar270 >> 4;
        uVar332 = uVar332 >> 4;
        uVar249 = ((ushort)auVar331[8] - (uVar324 + uVar311)) + uVar253 + uVar335;
        uVar226 = (uStack_2d6 - (uStack_136 + uStack_1c6)) + uStack_206 + uVar338;
        uVar227 = (uStack_2d4 - (uStack_134 + uStack_1c4)) + uStack_204 + uVar341;
        uVar228 = (uStack_2d2 - (uStack_132 + uStack_1c2)) + uStack_202 + uVar344;
        uVar261 = (uStack_2d0 - (uStack_130 + uStack_1c0)) + uStack_200 + uVar347;
        uVar265 = (uStack_2ce - (uStack_12e + uStack_1be)) + uStack_1fe + uVar358;
        uVar271 = (uStack_2cc - (uStack_12c + uStack_1bc)) + uStack_1fc + uVar350;
        uVar230 = (uStack_2ca - (uStack_12a + uStack_1ba)) + uStack_1fa + uVar323;
        uVar335 = uVar335 >> 4;
        uVar338 = uVar338 >> 4;
        uVar341 = uVar341 >> 4;
        uVar344 = uVar344 >> 4;
        uVar347 = uVar347 >> 4;
        uVar358 = uVar358 >> 4;
        uVar350 = uVar350 >> 4;
        uVar323 = uVar323 >> 4;
        auVar361[1] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
        auVar361[0] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
        auVar361[2] = (uVar259 != 0) * (uVar259 < 0x100) * (char)uVar259 - (0xff < uVar259);
        auVar361[3] = (uVar263 != 0) * (uVar263 < 0x100) * (char)uVar263 - (0xff < uVar263);
        auVar361[4] = (uVar268 != 0) * (uVar268 < 0x100) * (char)uVar268 - (0xff < uVar268);
        auVar361[5] = (uVar273 != 0) * (uVar273 < 0x100) * (char)uVar273 - (0xff < uVar273);
        auVar361[6] = (uVar270 != 0) * (uVar270 < 0x100) * (char)uVar270 - (0xff < uVar270);
        auVar361[7] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
        auVar361[8] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
        auVar361[9] = (uVar338 != 0) * (uVar338 < 0x100) * (char)uVar338 - (0xff < uVar338);
        auVar361[10] = (uVar341 != 0) * (uVar341 < 0x100) * (char)uVar341 - (0xff < uVar341);
        auVar361[0xb] = (uVar344 != 0) * (uVar344 < 0x100) * (char)uVar344 - (0xff < uVar344);
        auVar361[0xc] = (uVar347 != 0) * (uVar347 < 0x100) * (char)uVar347 - (0xff < uVar347);
        auVar361[0xd] = (uVar358 != 0) * (uVar358 < 0x100) * (char)uVar358 - (0xff < uVar358);
        auVar361[0xe] = (uVar350 != 0) * (uVar350 < 0x100) * (char)uVar350 - (0xff < uVar350);
        auVar361[0xf] = (uVar323 != 0) * (uVar323 < 0x100) * (char)uVar323 - (0xff < uVar323);
        *(undefined1 (*) [16])(s + lVar166 * 3) = ~local_1d8 & auVar326 | auVar361 & local_1d8;
        uVar171 = uVar183 >> 4;
        uVar185 = uVar189 >> 4;
        uVar170 = uVar201 >> 4;
        uVar184 = uVar209 >> 4;
        uVar229 = uVar221 >> 4;
        uVar202 = uVar260 >> 4;
        uVar169 = uVar264 >> 4;
        uVar210 = uVar269 >> 4;
        uVar168 = uVar249 >> 4;
        uVar197 = uVar226 >> 4;
        uVar206 = uVar227 >> 4;
        uVar217 = uVar228 >> 4;
        uVar250 = uVar261 >> 4;
        uVar262 = uVar265 >> 4;
        uVar266 = uVar271 >> 4;
        uVar272 = uVar230 >> 4;
        auVar179[1] = (uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185);
        auVar179[0] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar179[2] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar179[3] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
        auVar179[4] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
        auVar179[5] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        auVar179[6] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar179[7] = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
        auVar179[8] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        auVar179[9] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar179[10] = (uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 - (0xff < uVar206);
        auVar179[0xb] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
        auVar179[0xc] = (uVar250 != 0) * (uVar250 < 0x100) * (char)uVar250 - (0xff < uVar250);
        auVar179[0xd] = (uVar262 != 0) * (uVar262 < 0x100) * (char)uVar262 - (0xff < uVar262);
        auVar179[0xe] = (uVar266 != 0) * (uVar266 < 0x100) * (char)uVar266 - (0xff < uVar266);
        auVar179[0xf] = (uVar272 != 0) * (uVar272 < 0x100) * (char)uVar272 - (0xff < uVar272);
        *(undefined1 (*) [16])(s + lVar166 * 4) = ~local_1d8 & auVar255 | auVar179 & local_1d8;
        uVar169 = (ushort)((uVar274 * 2 - (uVar212 + uVar232)) + uVar183) >> 4;
        uVar210 = (ushort)((sStack_86 * 2 - (sVar216 + sStack_e6)) + uVar189) >> 4;
        uVar168 = (ushort)((sStack_84 * 2 - (sVar218 + sStack_e4)) + uVar201) >> 4;
        uVar183 = (ushort)((sStack_82 * 2 - (sVar219 + sStack_e2)) + uVar209) >> 4;
        uVar189 = (ushort)((sStack_80 * 2 - (sVar220 + sStack_e0)) + uVar221) >> 4;
        uVar197 = (ushort)((sStack_7e * 2 - (sVar222 + sStack_de)) + uVar260) >> 4;
        uVar201 = (ushort)((sStack_7c * 2 - (sVar223 + sStack_dc)) + uVar264) >> 4;
        uVar193 = (ushort)((uVar193 * 2 - (uVar317 + uVar322)) + uVar269) >> 4;
        uVar171 = (ushort)((uVar253 * 2 - (uVar362 + uVar213)) + uVar249) >> 4;
        uVar185 = (ushort)((uStack_206 * 2 - (uStack_256 + uStack_f6)) + uVar226) >> 4;
        uVar317 = (ushort)((uStack_204 * 2 - (uStack_254 + uStack_f4)) + uVar227) >> 4;
        uVar170 = (ushort)((uStack_202 * 2 - (uStack_252 + uStack_f2)) + uVar228) >> 4;
        uVar184 = (ushort)((uStack_200 * 2 - (uStack_250 + uStack_f0)) + uVar261) >> 4;
        uVar229 = (ushort)((uStack_1fe * 2 - (uStack_24e + uStack_ee)) + uVar265) >> 4;
        uVar322 = (ushort)((uStack_1fc * 2 - (uStack_24c + uStack_ec)) + uVar271) >> 4;
        uVar202 = (ushort)((uStack_1fa * 2 - (uStack_24a + uStack_ea)) + uVar230) >> 4;
        auVar326[1] = (uVar210 != 0) * (uVar210 < 0x100) * (char)uVar210 - (0xff < uVar210);
        auVar326[0] = (uVar169 != 0) * (uVar169 < 0x100) * (char)uVar169 - (0xff < uVar169);
        auVar326[2] = (uVar168 != 0) * (uVar168 < 0x100) * (char)uVar168 - (0xff < uVar168);
        auVar326[3] = (uVar183 != 0) * (uVar183 < 0x100) * (char)uVar183 - (0xff < uVar183);
        auVar326[4] = (uVar189 != 0) * (uVar189 < 0x100) * (char)uVar189 - (0xff < uVar189);
        auVar326[5] = (uVar197 != 0) * (uVar197 < 0x100) * (char)uVar197 - (0xff < uVar197);
        auVar326[6] = (uVar201 != 0) * (uVar201 < 0x100) * (char)uVar201 - (0xff < uVar201);
        auVar326[7] = (uVar193 != 0) * (uVar193 < 0x100) * (char)uVar193 - (0xff < uVar193);
        auVar326[8] = (uVar171 != 0) * (uVar171 < 0x100) * (char)uVar171 - (0xff < uVar171);
        auVar326[9] = (uVar185 != 0) * (uVar185 < 0x100) * (char)uVar185 - (0xff < uVar185);
        auVar326[10] = (uVar317 != 0) * (uVar317 < 0x100) * (char)uVar317 - (0xff < uVar317);
        auVar326[0xb] = (uVar170 != 0) * (uVar170 < 0x100) * (char)uVar170 - (0xff < uVar170);
        auVar326[0xc] = (uVar184 != 0) * (uVar184 < 0x100) * (char)uVar184 - (0xff < uVar184);
        auVar326[0xd] = (uVar229 != 0) * (uVar229 < 0x100) * (char)uVar229 - (0xff < uVar229);
        auVar326[0xe] = (uVar322 != 0) * (uVar322 < 0x100) * (char)uVar322 - (0xff < uVar322);
        auVar326[0xf] = (uVar202 != 0) * (uVar202 < 0x100) * (char)uVar202 - (0xff < uVar202);
        *(undefined1 (*) [16])(s + lVar166 * 5) = ~local_1d8 & auVar331 | auVar326 & local_1d8;
      }
    }
  }
  return;
}

Assistant:

void aom_lpf_horizontal_14_quad_sse2(unsigned char *s, int p,
                                     const unsigned char *_blimit0,
                                     const unsigned char *_limit0,
                                     const unsigned char *_thresh0) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi8(1);
  const __m128i blimit_v = _mm_load_si128((const __m128i *)_blimit0);
  const __m128i limit_v = _mm_load_si128((const __m128i *)_limit0);
  const __m128i thresh_v = _mm_load_si128((const __m128i *)_thresh0);
  __m128i mask, hev, flat, flat2;
  __m128i p6, p5;
  __m128i p4, p3, p2, p1, p0, q0, q1, q2, q3, q4;
  __m128i q6, q5;

  __m128i op2, op1, op0, oq0, oq1, oq2;

  __m128i max_abs_p1p0q1q0;

  p6 = _mm_loadu_si128((__m128i *)(s - 7 * p));
  p5 = _mm_loadu_si128((__m128i *)(s - 6 * p));
  p4 = _mm_loadu_si128((__m128i *)(s - 5 * p));
  p3 = _mm_loadu_si128((__m128i *)(s - 4 * p));
  p2 = _mm_loadu_si128((__m128i *)(s - 3 * p));
  p1 = _mm_loadu_si128((__m128i *)(s - 2 * p));
  p0 = _mm_loadu_si128((__m128i *)(s - 1 * p));
  q0 = _mm_loadu_si128((__m128i *)(s - 0 * p));
  q1 = _mm_loadu_si128((__m128i *)(s + 1 * p));
  q2 = _mm_loadu_si128((__m128i *)(s + 2 * p));
  q3 = _mm_loadu_si128((__m128i *)(s + 3 * p));
  q4 = _mm_loadu_si128((__m128i *)(s + 4 * p));
  q5 = _mm_loadu_si128((__m128i *)(s + 5 * p));
  q6 = _mm_loadu_si128((__m128i *)(s + 6 * p));

  {
    const __m128i abs_p1p0 = abs_diff(p1, p0);
    const __m128i abs_q1q0 = abs_diff(q1, q0);
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i ff = _mm_cmpeq_epi8(zero, zero);
    __m128i abs_p0q0 = abs_diff(p0, q0);
    __m128i abs_p1q1 = abs_diff(p1, q1);
    __m128i work;
    max_abs_p1p0q1q0 = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(max_abs_p1p0q1q0, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(abs_diff(p2, p1), abs_diff(p3, p2));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(abs_diff(q2, q1), abs_diff(q3, q2));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  {
    __m128i work;
    work = _mm_max_epu8(abs_diff(p2, p0), abs_diff(q2, q0));
    flat = _mm_max_epu8(work, max_abs_p1p0q1q0);
    work = _mm_max_epu8(abs_diff(p3, p0), abs_diff(q3, q0));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(abs_diff(p4, p0), abs_diff(q4, q0));
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);
    flat2 = _mm_max_epu8(abs_diff(p5, p0), abs_diff(q5, q0));
    flat2 = _mm_max_epu8(work, flat2);
    work = _mm_max_epu8(abs_diff(p6, p0), abs_diff(q6, q0));
    flat2 = _mm_max_epu8(work, flat2);
    flat2 = _mm_subs_epu8(flat2, one);
    flat2 = _mm_cmpeq_epi8(flat2, zero);
    flat2 = _mm_and_si128(flat2, flat);  // flat2 & flat & mask
  }

  // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
  // filter4
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i ff = _mm_cmpeq_epi8(t4, t4);

    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;

    op1 = _mm_xor_si128(p1, t80);
    op0 = _mm_xor_si128(p0, t80);
    oq0 = _mm_xor_si128(q0, t80);
    oq1 = _mm_xor_si128(q1, t80);

    hev = _mm_subs_epu8(max_abs_p1p0q1q0, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);
    filt = _mm_and_si128(_mm_subs_epi8(op1, oq1), hev);

    work_a = _mm_subs_epi8(oq0, op0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);
    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    oq0 = _mm_xor_si128(_mm_subs_epi8(oq0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    op0 = _mm_xor_si128(_mm_adds_epi8(op0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    op1 = _mm_xor_si128(_mm_adds_epi8(op1, filt), t80);
    oq1 = _mm_xor_si128(_mm_subs_epi8(oq1, filt), t80);

    // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
    // filter8
    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m128i four = _mm_set1_epi16(4);
      const __m128i p3_lo = _mm_unpacklo_epi8(p3, zero);
      const __m128i p2_lo = _mm_unpacklo_epi8(p2, zero);
      const __m128i p1_lo = _mm_unpacklo_epi8(p1, zero);
      const __m128i p0_lo = _mm_unpacklo_epi8(p0, zero);
      const __m128i q0_lo = _mm_unpacklo_epi8(q0, zero);
      const __m128i q1_lo = _mm_unpacklo_epi8(q1, zero);
      const __m128i q2_lo = _mm_unpacklo_epi8(q2, zero);
      const __m128i q3_lo = _mm_unpacklo_epi8(q3, zero);

      const __m128i p3_hi = _mm_unpackhi_epi8(p3, zero);
      const __m128i p2_hi = _mm_unpackhi_epi8(p2, zero);
      const __m128i p1_hi = _mm_unpackhi_epi8(p1, zero);
      const __m128i p0_hi = _mm_unpackhi_epi8(p0, zero);
      const __m128i q0_hi = _mm_unpackhi_epi8(q0, zero);
      const __m128i q1_hi = _mm_unpackhi_epi8(q1, zero);
      const __m128i q2_hi = _mm_unpackhi_epi8(q2, zero);
      const __m128i q3_hi = _mm_unpackhi_epi8(q3, zero);
      __m128i f8_lo, f8_hi;

      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, four),
                            _mm_add_epi16(p3_lo, p2_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f8_lo),
                            _mm_add_epi16(p2_lo, p1_lo));
      f8_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f8_lo);

      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, four),
                            _mm_add_epi16(p3_hi, p2_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f8_hi),
                            _mm_add_epi16(p2_hi, p1_hi));
      f8_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f8_hi);

      op2 = filter8_mask(&flat, &p2, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q1_lo, &p1_lo, &p2_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q1_hi, &p1_hi, &p2_hi, &p3_hi);
      op1 = filter8_mask(&flat, &op1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q2_lo, &p0_lo, &p1_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q2_hi, &p0_hi, &p1_hi, &p3_hi);
      op0 = filter8_mask(&flat, &op0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q0_lo, &p0_lo, &p3_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q0_hi, &p0_hi, &p3_hi);
      oq0 = filter8_mask(&flat, &oq0, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q1_lo, &q0_lo, &p2_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q1_hi, &q0_hi, &p2_hi);
      oq1 = filter8_mask(&flat, &oq1, &f8_lo, &f8_hi);

      f8_lo = filter_add2_sub2(&f8_lo, &q3_lo, &q2_lo, &q1_lo, &p1_lo);
      f8_hi = filter_add2_sub2(&f8_hi, &q3_hi, &q2_hi, &q1_hi, &p1_hi);
      oq2 = filter8_mask(&flat, &q2, &f8_lo, &f8_hi);

      // ~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
      // wide flat calculations
      if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat2, zero))) {
        const __m128i eight = _mm_set1_epi16(8);
        const __m128i p6_lo = _mm_unpacklo_epi8(p6, zero);
        const __m128i p5_lo = _mm_unpacklo_epi8(p5, zero);
        const __m128i p4_lo = _mm_unpacklo_epi8(p4, zero);
        const __m128i q4_lo = _mm_unpacklo_epi8(q4, zero);
        const __m128i q5_lo = _mm_unpacklo_epi8(q5, zero);
        const __m128i q6_lo = _mm_unpacklo_epi8(q6, zero);

        const __m128i p6_hi = _mm_unpackhi_epi8(p6, zero);
        const __m128i p5_hi = _mm_unpackhi_epi8(p5, zero);
        const __m128i p4_hi = _mm_unpackhi_epi8(p4, zero);
        const __m128i q4_hi = _mm_unpackhi_epi8(q4, zero);
        const __m128i q5_hi = _mm_unpackhi_epi8(q5, zero);
        const __m128i q6_hi = _mm_unpackhi_epi8(q6, zero);

        __m128i f_lo;
        __m128i f_hi;

        f_lo = _mm_sub_epi16(_mm_slli_epi16(p6_lo, 3), p6_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p5_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_slli_epi16(p4_lo, 1), f_lo);
        f_lo = _mm_add_epi16(_mm_add_epi16(p3_lo, f_lo),
                             _mm_add_epi16(p2_lo, p1_lo));
        f_lo = _mm_add_epi16(_mm_add_epi16(p0_lo, q0_lo), f_lo);
        f_lo = _mm_add_epi16(f_lo, eight);

        f_hi = _mm_sub_epi16(_mm_slli_epi16(p6_hi, 3), p6_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p5_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_slli_epi16(p4_hi, 1), f_hi);
        f_hi = _mm_add_epi16(_mm_add_epi16(p3_hi, f_hi),
                             _mm_add_epi16(p2_hi, p1_hi));
        f_hi = _mm_add_epi16(_mm_add_epi16(p0_hi, q0_hi), f_hi);
        f_hi = _mm_add_epi16(f_hi, eight);

        p5 = filter16_mask(&flat2, &p5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 6 * p), p5);

        f_lo = filter_add2_sub2(&f_lo, &q1_lo, &p3_lo, &p6_lo, &p6_lo);
        f_hi = filter_add2_sub2(&f_hi, &q1_hi, &p3_hi, &p6_hi, &p6_hi);
        p4 = filter16_mask(&flat2, &p4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 5 * p), p4);

        f_lo = filter_add2_sub2(&f_lo, &q2_lo, &p2_lo, &p6_lo, &p5_lo);
        f_hi = filter_add2_sub2(&f_hi, &q2_hi, &p2_hi, &p6_hi, &p5_hi);
        p3 = filter16_mask(&flat2, &p3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 4 * p), p3);

        f_lo = filter_add2_sub2(&f_lo, &q3_lo, &p1_lo, &p6_lo, &p4_lo);
        f_hi = filter_add2_sub2(&f_hi, &q3_hi, &p1_hi, &p6_hi, &p4_hi);
        op2 = filter16_mask(&flat2, &op2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);

        f_lo = filter_add2_sub2(&f_lo, &q4_lo, &p0_lo, &p6_lo, &p3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q4_hi, &p0_hi, &p6_hi, &p3_hi);
        op1 = filter16_mask(&flat2, &op1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);

        f_lo = filter_add2_sub2(&f_lo, &q5_lo, &q0_lo, &p6_lo, &p2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q5_hi, &q0_hi, &p6_hi, &p2_hi);
        op0 = filter16_mask(&flat2, &op0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q1_lo, &p6_lo, &p1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q1_hi, &p6_hi, &p1_hi);
        oq0 = filter16_mask(&flat2, &oq0, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q2_lo, &p5_lo, &p0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q2_hi, &p5_hi, &p0_hi);
        oq1 = filter16_mask(&flat2, &oq1, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q3_lo, &p4_lo, &q0_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q3_hi, &p4_hi, &q0_hi);
        oq2 = filter16_mask(&flat2, &oq2, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q4_lo, &p3_lo, &q1_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q4_hi, &p3_hi, &q1_hi);
        q3 = filter16_mask(&flat2, &q3, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 3 * p), q3);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q5_lo, &p2_lo, &q2_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q5_hi, &p2_hi, &q2_hi);
        q4 = filter16_mask(&flat2, &q4, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 4 * p), q4);

        f_lo = filter_add2_sub2(&f_lo, &q6_lo, &q6_lo, &p1_lo, &q3_lo);
        f_hi = filter_add2_sub2(&f_hi, &q6_hi, &q6_hi, &p1_hi, &q3_hi);
        q5 = filter16_mask(&flat2, &q5, &f_lo, &f_hi);
        _mm_storeu_si128((__m128i *)(s + 5 * p), q5);
      } else {
        _mm_storeu_si128((__m128i *)(s - 3 * p), op2);
        _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
        _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
        _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
        _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
        _mm_storeu_si128((__m128i *)(s + 2 * p), oq2);
      }
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), op1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), op0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), oq0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), oq1);
    }
  }
}